

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined4 uVar4;
  BBox1f BVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [12];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  uint uVar66;
  uint uVar67;
  ulong uVar68;
  uint uVar69;
  long lVar70;
  byte bVar71;
  long lVar72;
  uint uVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar115;
  vint4 bi_2;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar116;
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar92 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar117;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar130 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 extraout_var [56];
  vint4 bi;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar183;
  float fVar184;
  float fVar196;
  float fVar198;
  vint4 ai_1;
  float fVar200;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar197;
  float fVar199;
  float fVar201;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar202;
  undefined1 auVar195 [32];
  float fVar203;
  float fVar204;
  float fVar225;
  float fVar227;
  vint4 ai_2;
  undefined1 auVar205 [16];
  float fVar230;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar226;
  float fVar228;
  float fVar229;
  float fVar231;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar232;
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar247;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar248;
  vint4 ai;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar259 [16];
  vfloat4 b0;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  float fVar267;
  float fVar284;
  float fVar285;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar286;
  float fVar287;
  undefined1 auVar283 [32];
  float fVar288;
  float fVar300;
  float fVar301;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar303;
  float fVar304;
  float fVar305;
  undefined1 auVar298 [32];
  float fVar302;
  undefined1 auVar299 [32];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [32];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [32];
  float fVar327;
  float fVar334;
  float fVar335;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  float fVar336;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  float fVar346;
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar356 [64];
  float fVar363;
  vfloat4 a0;
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [64];
  undefined1 local_608 [8];
  float fStack_600;
  float fStack_5fc;
  vfloat_impl<4> p00;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  undefined1 local_568 [8];
  float fStack_560;
  float fStack_55c;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float fStack_520;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined1 local_448 [16];
  undefined1 (*local_438) [16];
  Primitive *local_430;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  vfloat_impl<4> p03;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  BBox1f cu_stack [4];
  RTCHitN local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  BBox1f cv_stack [4];
  undefined1 auVar258 [32];
  undefined1 auVar355 [32];
  
  PVar6 = prim[1];
  uVar68 = (ulong)(byte)PVar6;
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  lVar70 = uVar68 * 0x25;
  auVar276 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 6)));
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xf + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x11 + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1a + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1b + 6)));
  auVar122 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1c + 6)));
  auVar160 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar160 = vinsertps_avx(auVar160,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar311 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar311 = vinsertps_avx(auVar311,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar183 = *(float *)(prim + lVar70 + 0x12);
  auVar160 = vsubps_avx(auVar160,*(undefined1 (*) [16])(prim + lVar70 + 6));
  auVar96._0_4_ = fVar183 * auVar160._0_4_;
  auVar96._4_4_ = fVar183 * auVar160._4_4_;
  auVar96._8_4_ = fVar183 * auVar160._8_4_;
  auVar96._12_4_ = fVar183 * auVar160._12_4_;
  auVar347._0_4_ = fVar183 * auVar311._0_4_;
  auVar347._4_4_ = fVar183 * auVar311._4_4_;
  auVar347._8_4_ = fVar183 * auVar311._8_4_;
  auVar347._12_4_ = fVar183 * auVar311._12_4_;
  auVar15 = vcvtdq2ps_avx(auVar18);
  auVar159 = vcvtdq2ps_avx(auVar276);
  auVar275 = vcvtdq2ps_avx(auVar210);
  auVar16 = vcvtdq2ps_avx(auVar289);
  auVar17 = vcvtdq2ps_avx(auVar19);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar160 = vshufps_avx(auVar347,auVar347,0);
  auVar311 = vshufps_avx(auVar347,auVar347,0x55);
  auVar18 = vshufps_avx(auVar347,auVar347,0xaa);
  fVar232 = auVar18._0_4_;
  fVar244 = auVar18._4_4_;
  fVar245 = auVar18._8_4_;
  fVar246 = auVar18._12_4_;
  fVar183 = auVar311._0_4_;
  fVar196 = auVar311._4_4_;
  fVar198 = auVar311._8_4_;
  fVar200 = auVar311._12_4_;
  fVar203 = auVar160._0_4_;
  fVar225 = auVar160._4_4_;
  fVar227 = auVar160._8_4_;
  fVar230 = auVar160._12_4_;
  auVar268._0_4_ = fVar203 * auVar15._0_4_ + auVar159._0_4_ * fVar183 + fVar232 * auVar275._0_4_;
  auVar268._4_4_ = fVar225 * auVar15._4_4_ + auVar159._4_4_ * fVar196 + fVar244 * auVar275._4_4_;
  auVar268._8_4_ = fVar227 * auVar15._8_4_ + auVar159._8_4_ * fVar198 + fVar245 * auVar275._8_4_;
  auVar268._12_4_ = fVar230 * auVar15._12_4_ + auVar159._12_4_ * fVar200 + fVar246 * auVar275._12_4_
  ;
  auVar341._0_4_ = fVar203 * auVar16._0_4_ + fVar183 * auVar17._0_4_ + fVar232 * auVar77._0_4_;
  auVar341._4_4_ = fVar225 * auVar16._4_4_ + fVar196 * auVar17._4_4_ + fVar244 * auVar77._4_4_;
  auVar341._8_4_ = fVar227 * auVar16._8_4_ + fVar198 * auVar17._8_4_ + fVar245 * auVar77._8_4_;
  auVar341._12_4_ = fVar230 * auVar16._12_4_ + fVar200 * auVar17._12_4_ + fVar246 * auVar77._12_4_;
  auVar144._0_4_ = fVar203 * auVar78._0_4_ + fVar232 * auVar122._0_4_ + fVar183 * auVar79._0_4_;
  auVar144._4_4_ = fVar225 * auVar78._4_4_ + fVar244 * auVar122._4_4_ + fVar196 * auVar79._4_4_;
  auVar144._8_4_ = fVar227 * auVar78._8_4_ + fVar245 * auVar122._8_4_ + fVar198 * auVar79._8_4_;
  auVar144._12_4_ = fVar230 * auVar78._12_4_ + fVar246 * auVar122._12_4_ + fVar200 * auVar79._12_4_;
  auVar357._8_4_ = 0x7fffffff;
  auVar357._0_8_ = 0x7fffffff7fffffff;
  auVar357._12_4_ = 0x7fffffff;
  auVar160 = vandps_avx(auVar268,auVar357);
  auVar348._8_4_ = 0x219392ef;
  auVar348._0_8_ = 0x219392ef219392ef;
  auVar348._12_4_ = 0x219392ef;
  auVar160 = vcmpps_avx(auVar160,auVar348,1);
  auVar210 = vblendvps_avx(auVar268,auVar348,auVar160);
  auVar160 = vandps_avx(auVar341,auVar357);
  auVar160 = vcmpps_avx(auVar160,auVar348,1);
  auVar289 = vblendvps_avx(auVar341,auVar348,auVar160);
  auVar160 = vandps_avx(auVar357,auVar144);
  auVar160 = vcmpps_avx(auVar160,auVar348,1);
  auVar19 = vblendvps_avx(auVar144,auVar348,auVar160);
  auVar160 = vshufps_avx(auVar96,auVar96,0x55);
  auVar311 = vshufps_avx(auVar96,auVar96,0xaa);
  fVar232 = auVar311._0_4_;
  fVar244 = auVar311._4_4_;
  fVar245 = auVar311._8_4_;
  fVar246 = auVar311._12_4_;
  fVar203 = auVar160._0_4_;
  fVar225 = auVar160._4_4_;
  fVar227 = auVar160._8_4_;
  fVar230 = auVar160._12_4_;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar160 = vpmovsxwd_avx(auVar160);
  auVar311._8_8_ = 0;
  auVar311._0_8_ = *(ulong *)(prim + uVar68 * 0xb + 6);
  auVar311 = vpmovsxwd_avx(auVar311);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar68 * 9 + 6);
  auVar18 = vpmovsxwd_avx(auVar18);
  auVar276._8_8_ = 0;
  auVar276._0_8_ = *(ulong *)(prim + uVar68 * 0xd + 6);
  auVar276 = vpmovsxwd_avx(auVar276);
  auVar121 = vshufps_avx(auVar96,auVar96,0);
  fVar183 = auVar121._0_4_;
  fVar196 = auVar121._4_4_;
  fVar198 = auVar121._8_4_;
  fVar200 = auVar121._12_4_;
  auVar151._0_4_ = fVar203 * auVar159._0_4_ + fVar232 * auVar275._0_4_ + fVar183 * auVar15._0_4_;
  auVar151._4_4_ = fVar225 * auVar159._4_4_ + fVar244 * auVar275._4_4_ + fVar196 * auVar15._4_4_;
  auVar151._8_4_ = fVar227 * auVar159._8_4_ + fVar245 * auVar275._8_4_ + fVar198 * auVar15._8_4_;
  auVar151._12_4_ = fVar230 * auVar159._12_4_ + fVar246 * auVar275._12_4_ + fVar200 * auVar15._12_4_
  ;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar68 * 0x12 + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar121._0_4_ = fVar232 * auVar77._0_4_ + fVar203 * auVar17._0_4_ + fVar183 * auVar16._0_4_;
  auVar121._4_4_ = fVar244 * auVar77._4_4_ + fVar225 * auVar17._4_4_ + fVar196 * auVar16._4_4_;
  auVar121._8_4_ = fVar245 * auVar77._8_4_ + fVar227 * auVar17._8_4_ + fVar198 * auVar16._8_4_;
  auVar121._12_4_ = fVar246 * auVar77._12_4_ + fVar230 * auVar17._12_4_ + fVar200 * auVar16._12_4_;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + uVar68 * 0x16 + 6);
  auVar159 = vpmovsxwd_avx(auVar159);
  auVar77._0_4_ = fVar232 * auVar122._0_4_ + fVar203 * auVar79._0_4_ + fVar183 * auVar78._0_4_;
  auVar77._4_4_ = fVar244 * auVar122._4_4_ + fVar225 * auVar79._4_4_ + fVar196 * auVar78._4_4_;
  auVar77._8_4_ = fVar245 * auVar122._8_4_ + fVar227 * auVar79._8_4_ + fVar198 * auVar78._8_4_;
  auVar77._12_4_ = fVar246 * auVar122._12_4_ + fVar230 * auVar79._12_4_ + fVar200 * auVar78._12_4_;
  auVar275 = vrcpps_avx(auVar210);
  fVar183 = auVar275._0_4_;
  auVar205._0_4_ = auVar210._0_4_ * fVar183;
  fVar196 = auVar275._4_4_;
  auVar205._4_4_ = auVar210._4_4_ * fVar196;
  fVar198 = auVar275._8_4_;
  auVar205._8_4_ = auVar210._8_4_ * fVar198;
  fVar200 = auVar275._12_4_;
  auVar205._12_4_ = auVar210._12_4_ * fVar200;
  auVar269._8_4_ = 0x3f800000;
  auVar269._0_8_ = 0x3f8000003f800000;
  auVar269._12_4_ = 0x3f800000;
  auVar210 = vsubps_avx(auVar269,auVar205);
  fVar183 = fVar183 + fVar183 * auVar210._0_4_;
  fVar196 = fVar196 + fVar196 * auVar210._4_4_;
  fVar198 = fVar198 + fVar198 * auVar210._8_4_;
  fVar200 = fVar200 + fVar200 * auVar210._12_4_;
  auVar210 = vrcpps_avx(auVar289);
  fVar203 = auVar210._0_4_;
  auVar166._0_4_ = fVar203 * auVar289._0_4_;
  fVar225 = auVar210._4_4_;
  auVar166._4_4_ = fVar225 * auVar289._4_4_;
  fVar227 = auVar210._8_4_;
  auVar166._8_4_ = fVar227 * auVar289._8_4_;
  fVar230 = auVar210._12_4_;
  auVar166._12_4_ = fVar230 * auVar289._12_4_;
  auVar210 = vsubps_avx(auVar269,auVar166);
  fVar203 = fVar203 + fVar203 * auVar210._0_4_;
  fVar225 = fVar225 + fVar225 * auVar210._4_4_;
  fVar227 = fVar227 + fVar227 * auVar210._8_4_;
  fVar230 = fVar230 + fVar230 * auVar210._12_4_;
  auVar210 = vrcpps_avx(auVar19);
  fVar232 = auVar210._0_4_;
  auVar132._0_4_ = fVar232 * auVar19._0_4_;
  fVar244 = auVar210._4_4_;
  auVar132._4_4_ = fVar244 * auVar19._4_4_;
  fVar245 = auVar210._8_4_;
  auVar132._8_4_ = fVar245 * auVar19._8_4_;
  fVar246 = auVar210._12_4_;
  auVar132._12_4_ = fVar246 * auVar19._12_4_;
  auVar210 = vsubps_avx(auVar269,auVar132);
  fVar232 = fVar232 + fVar232 * auVar210._0_4_;
  fVar244 = fVar244 + fVar244 * auVar210._4_4_;
  fVar245 = fVar245 + fVar245 * auVar210._8_4_;
  fVar246 = fVar246 + fVar246 * auVar210._12_4_;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = *(ulong *)(prim + uVar68 * 0x14 + 6);
  auVar210 = vpmovsxwd_avx(auVar210);
  auVar289 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar70 + 0x16)) *
                           *(float *)(prim + lVar70 + 0x1a)));
  auVar289 = vshufps_avx(auVar289,auVar289,0);
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar311 = vcvtdq2ps_avx(auVar311);
  auVar311 = vsubps_avx(auVar311,auVar160);
  fVar74 = auVar289._0_4_;
  fVar75 = auVar289._4_4_;
  fVar76 = auVar289._8_4_;
  fVar115 = auVar289._12_4_;
  auVar133._0_4_ = fVar74 * auVar311._0_4_ + auVar160._0_4_;
  auVar133._4_4_ = fVar75 * auVar311._4_4_ + auVar160._4_4_;
  auVar133._8_4_ = fVar76 * auVar311._8_4_ + auVar160._8_4_;
  auVar133._12_4_ = fVar115 * auVar311._12_4_ + auVar160._12_4_;
  auVar160 = vcvtdq2ps_avx(auVar18);
  auVar311 = vcvtdq2ps_avx(auVar276);
  auVar311 = vsubps_avx(auVar311,auVar160);
  auVar260._0_4_ = fVar74 * auVar311._0_4_ + auVar160._0_4_;
  auVar260._4_4_ = fVar75 * auVar311._4_4_ + auVar160._4_4_;
  auVar260._8_4_ = fVar76 * auVar311._8_4_ + auVar160._8_4_;
  auVar260._12_4_ = fVar115 * auVar311._12_4_ + auVar160._12_4_;
  auVar160 = vcvtdq2ps_avx(auVar15);
  auVar311 = vcvtdq2ps_avx(auVar159);
  auVar311 = vsubps_avx(auVar311,auVar160);
  auVar342._0_4_ = fVar74 * auVar311._0_4_ + auVar160._0_4_;
  auVar342._4_4_ = fVar75 * auVar311._4_4_ + auVar160._4_4_;
  auVar342._8_4_ = fVar76 * auVar311._8_4_ + auVar160._8_4_;
  auVar342._12_4_ = fVar115 * auVar311._12_4_ + auVar160._12_4_;
  auVar160 = vcvtdq2ps_avx(auVar210);
  auVar289._8_8_ = 0;
  auVar289._0_8_ = *(ulong *)(prim + uVar68 * 0x18 + 6);
  auVar311 = vpmovsxwd_avx(auVar289);
  auVar311 = vcvtdq2ps_avx(auVar311);
  auVar311 = vsubps_avx(auVar311,auVar160);
  auVar290._0_4_ = fVar74 * auVar311._0_4_ + auVar160._0_4_;
  auVar290._4_4_ = fVar75 * auVar311._4_4_ + auVar160._4_4_;
  auVar290._8_4_ = fVar76 * auVar311._8_4_ + auVar160._8_4_;
  auVar290._12_4_ = fVar115 * auVar311._12_4_ + auVar160._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar68 * 0x1d + 6);
  auVar160 = vpmovsxwd_avx(auVar19);
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar275._8_8_ = 0;
  auVar275._0_8_ = *(ulong *)(prim + uVar68 * 0x21 + 6);
  auVar311 = vpmovsxwd_avx(auVar275);
  auVar311 = vcvtdq2ps_avx(auVar311);
  auVar18 = vsubps_avx(auVar311,auVar160);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar68 * 0x1f + 6);
  auVar311 = vpmovsxwd_avx(auVar16);
  auVar306._0_4_ = fVar74 * auVar18._0_4_ + auVar160._0_4_;
  auVar306._4_4_ = fVar75 * auVar18._4_4_ + auVar160._4_4_;
  auVar306._8_4_ = fVar76 * auVar18._8_4_ + auVar160._8_4_;
  auVar306._12_4_ = fVar115 * auVar18._12_4_ + auVar160._12_4_;
  auVar160 = vcvtdq2ps_avx(auVar311);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar68 * 0x23 + 6);
  auVar311 = vpmovsxwd_avx(auVar17);
  auVar311 = vcvtdq2ps_avx(auVar311);
  auVar311 = vsubps_avx(auVar311,auVar160);
  auVar319._0_4_ = fVar74 * auVar311._0_4_ + auVar160._0_4_;
  auVar319._4_4_ = fVar75 * auVar311._4_4_ + auVar160._4_4_;
  auVar319._8_4_ = fVar76 * auVar311._8_4_ + auVar160._8_4_;
  auVar319._12_4_ = fVar115 * auVar311._12_4_ + auVar160._12_4_;
  auVar160 = vsubps_avx(auVar133,auVar151);
  auVar259._0_4_ = fVar183 * auVar160._0_4_;
  auVar259._4_4_ = fVar196 * auVar160._4_4_;
  auVar259._8_4_ = fVar198 * auVar160._8_4_;
  auVar259._12_4_ = fVar200 * auVar160._12_4_;
  auVar160 = vsubps_avx(auVar260,auVar151);
  auVar152._0_4_ = fVar183 * auVar160._0_4_;
  auVar152._4_4_ = fVar196 * auVar160._4_4_;
  auVar152._8_4_ = fVar198 * auVar160._8_4_;
  auVar152._12_4_ = fVar200 * auVar160._12_4_;
  auVar160 = vsubps_avx(auVar342,auVar121);
  auVar185._0_4_ = fVar203 * auVar160._0_4_;
  auVar185._4_4_ = fVar225 * auVar160._4_4_;
  auVar185._8_4_ = fVar227 * auVar160._8_4_;
  auVar185._12_4_ = fVar230 * auVar160._12_4_;
  auVar160 = vsubps_avx(auVar290,auVar121);
  auVar122._0_4_ = fVar203 * auVar160._0_4_;
  auVar122._4_4_ = fVar225 * auVar160._4_4_;
  auVar122._8_4_ = fVar227 * auVar160._8_4_;
  auVar122._12_4_ = fVar230 * auVar160._12_4_;
  auVar160 = vsubps_avx(auVar306,auVar77);
  auVar180._0_4_ = fVar232 * auVar160._0_4_;
  auVar180._4_4_ = fVar244 * auVar160._4_4_;
  auVar180._8_4_ = fVar245 * auVar160._8_4_;
  auVar180._12_4_ = fVar246 * auVar160._12_4_;
  auVar160 = vsubps_avx(auVar319,auVar77);
  auVar78._0_4_ = fVar232 * auVar160._0_4_;
  auVar78._4_4_ = fVar244 * auVar160._4_4_;
  auVar78._8_4_ = fVar245 * auVar160._8_4_;
  auVar78._12_4_ = fVar246 * auVar160._12_4_;
  auVar160 = vpminsd_avx(auVar259,auVar152);
  auVar311 = vpminsd_avx(auVar185,auVar122);
  auVar160 = vmaxps_avx(auVar160,auVar311);
  auVar311 = vpminsd_avx(auVar180,auVar78);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar291._4_4_ = uVar4;
  auVar291._0_4_ = uVar4;
  auVar291._8_4_ = uVar4;
  auVar291._12_4_ = uVar4;
  auVar311 = vmaxps_avx(auVar311,auVar291);
  auVar160 = vmaxps_avx(auVar160,auVar311);
  auVar233._0_4_ = auVar160._0_4_ * 0.99999964;
  auVar233._4_4_ = auVar160._4_4_ * 0.99999964;
  auVar233._8_4_ = auVar160._8_4_ * 0.99999964;
  auVar233._12_4_ = auVar160._12_4_ * 0.99999964;
  auVar160 = vpmaxsd_avx(auVar259,auVar152);
  auVar311 = vpmaxsd_avx(auVar185,auVar122);
  auVar160 = vminps_avx(auVar160,auVar311);
  auVar311 = vpmaxsd_avx(auVar180,auVar78);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar153._4_4_ = uVar4;
  auVar153._0_4_ = uVar4;
  auVar153._8_4_ = uVar4;
  auVar153._12_4_ = uVar4;
  auVar311 = vminps_avx(auVar311,auVar153);
  auVar160 = vminps_avx(auVar160,auVar311);
  auVar79._0_4_ = auVar160._0_4_ * 1.0000004;
  auVar79._4_4_ = auVar160._4_4_ * 1.0000004;
  auVar79._8_4_ = auVar160._8_4_ * 1.0000004;
  auVar79._12_4_ = auVar160._12_4_ * 1.0000004;
  auVar160 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar311 = vpcmpgtd_avx(auVar160,_DAT_01f4ad30);
  auVar160 = vcmpps_avx(auVar233,auVar79,2);
  auVar160 = vandps_avx(auVar160,auVar311);
  uVar73 = vmovmskps_avx(auVar160);
  auVar109._16_16_ = mm_lookupmask_ps._240_16_;
  auVar109._0_16_ = mm_lookupmask_ps._240_16_;
  local_198 = vblendps_avx(auVar109,ZEXT832(0) << 0x20,0x80);
  local_438 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar57 = ZEXT412(0);
  local_430 = prim;
LAB_00948132:
  auVar59._12_4_ = 0;
  auVar59._0_12_ = auVar57;
  if (uVar73 == 0) {
    return;
  }
  lVar70 = 0;
  if (uVar73 != 0) {
    for (; (uVar73 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
    }
  }
  uVar67 = *(uint *)(local_430 + 2);
  uVar7 = *(uint *)(local_430 + lVar70 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar67].ptr;
  fVar183 = (pGVar8->time_range).lower;
  fVar183 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar183) / ((pGVar8->time_range).upper - fVar183));
  auVar160 = vroundss_avx(ZEXT416((uint)fVar183),ZEXT416((uint)fVar183),9);
  auVar160 = vminss_avx(auVar160,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar160 = vmaxss_avx(auVar59 << 0x20,auVar160);
  uVar68 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)uVar7 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar72 = (long)(int)auVar160._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar72);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar72);
  pfVar3 = (float *)(lVar10 + lVar11 * uVar68);
  fVar196 = *pfVar3;
  fVar198 = pfVar3[1];
  fVar200 = pfVar3[2];
  fVar203 = pfVar3[3];
  lVar70 = uVar68 + 1;
  pfVar3 = (float *)(lVar10 + lVar11 * lVar70);
  fVar225 = *pfVar3;
  fVar227 = pfVar3[1];
  fVar230 = pfVar3[2];
  fVar232 = pfVar3[3];
  lVar1 = uVar68 + 2;
  pfVar3 = (float *)(lVar10 + lVar11 * lVar1);
  fVar244 = *pfVar3;
  fVar245 = pfVar3[1];
  fVar246 = pfVar3[2];
  fVar74 = pfVar3[3];
  lVar2 = uVar68 + 3;
  pfVar3 = (float *)(lVar10 + lVar11 * lVar2);
  fVar75 = *pfVar3;
  fVar76 = pfVar3[1];
  fVar115 = pfVar3[2];
  fVar116 = pfVar3[3];
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar72);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar72);
  pfVar3 = (float *)(lVar11 + lVar12 * uVar68);
  fVar184 = *pfVar3;
  fVar197 = pfVar3[1];
  fVar199 = pfVar3[2];
  fVar201 = pfVar3[3];
  pfVar3 = (float *)(lVar11 + lVar12 * lVar70);
  fVar204 = *pfVar3;
  fVar226 = pfVar3[1];
  fVar228 = pfVar3[2];
  fVar231 = pfVar3[3];
  pfVar3 = (float *)(lVar11 + lVar12 * lVar1);
  fVar117 = *pfVar3;
  fVar118 = pfVar3[1];
  fVar119 = pfVar3[2];
  fVar120 = pfVar3[3];
  fVar183 = fVar183 - auVar160._0_4_;
  pfVar3 = (float *)(lVar11 + lVar12 * lVar2);
  fVar202 = *pfVar3;
  fVar247 = pfVar3[1];
  fVar229 = pfVar3[2];
  fVar267 = pfVar3[3];
  auVar80._0_4_ = fVar225 * 0.0 + fVar244 * 0.5 + fVar75 * 0.0;
  auVar80._4_4_ = fVar227 * 0.0 + fVar245 * 0.5 + fVar76 * 0.0;
  auVar80._8_4_ = fVar230 * 0.0 + fVar246 * 0.5 + fVar115 * 0.0;
  auVar80._12_4_ = fVar232 * 0.0 + fVar74 * 0.5 + fVar116 * 0.0;
  auVar154._0_4_ = fVar196 * 0.5;
  auVar154._4_4_ = fVar198 * 0.5;
  auVar154._8_4_ = fVar200 * 0.5;
  auVar154._12_4_ = fVar203 * 0.5;
  auVar289 = vsubps_avx(auVar80,auVar154);
  auVar81._0_4_ = fVar204 * 0.0 + fVar117 * 0.5 + fVar202 * 0.0;
  auVar81._4_4_ = fVar226 * 0.0 + fVar118 * 0.5 + fVar247 * 0.0;
  auVar81._8_4_ = fVar228 * 0.0 + fVar119 * 0.5 + fVar229 * 0.0;
  auVar81._12_4_ = fVar231 * 0.0 + fVar120 * 0.5 + fVar267 * 0.0;
  auVar349._0_4_ = fVar184 * 0.5;
  auVar349._4_4_ = fVar197 * 0.5;
  auVar349._8_4_ = fVar199 * 0.5;
  auVar349._12_4_ = fVar201 * 0.5;
  auVar276 = vsubps_avx(auVar81,auVar349);
  local_5c8._0_4_ = fVar196 * -0.0 + fVar244 * 0.0 + fVar75 * -0.0 + fVar225;
  local_5c8._4_4_ = fVar198 * -0.0 + fVar245 * 0.0 + fVar76 * -0.0 + fVar227;
  fStack_5c0 = fVar200 * -0.0 + fVar246 * 0.0 + fVar115 * -0.0 + fVar230;
  fStack_5bc = fVar203 * -0.0 + fVar74 * 0.0 + fVar116 * -0.0 + fVar232;
  p00.field_0.v[0] = fVar196 * -0.0 + fVar225 * 0.0 + fVar244 + fVar75 * -0.0;
  p00.field_0.v[1] = fVar198 * -0.0 + fVar227 * 0.0 + fVar245 + fVar76 * -0.0;
  p00.field_0.v[2] = fVar200 * -0.0 + fVar230 * 0.0 + fVar246 + fVar115 * -0.0;
  p00.field_0.v[3] = fVar203 * -0.0 + fVar232 * 0.0 + fVar74 + fVar116 * -0.0;
  auVar270._0_4_ = fVar244 * 0.0 + fVar75 * 0.5;
  auVar270._4_4_ = fVar245 * 0.0 + fVar76 * 0.5;
  auVar270._8_4_ = fVar246 * 0.0 + fVar115 * 0.5;
  auVar270._12_4_ = fVar74 * 0.0 + fVar116 * 0.5;
  auVar206._0_4_ = fVar225 * 0.5;
  auVar206._4_4_ = fVar227 * 0.5;
  auVar206._8_4_ = fVar230 * 0.5;
  auVar206._12_4_ = fVar232 * 0.5;
  auVar160 = vsubps_avx(auVar270,auVar206);
  auVar358._0_4_ = fVar184 * -0.0 + fVar117 * 0.0 + fVar202 * -0.0 + fVar204;
  auVar358._4_4_ = fVar197 * -0.0 + fVar118 * 0.0 + fVar247 * -0.0 + fVar226;
  auVar358._8_4_ = fVar199 * -0.0 + fVar119 * 0.0 + fVar229 * -0.0 + fVar228;
  auVar358._12_4_ = fVar201 * -0.0 + fVar120 * 0.0 + fVar267 * -0.0 + fVar231;
  auVar292._0_4_ = fVar196 * 0.0 + auVar160._0_4_;
  auVar292._4_4_ = fVar198 * 0.0 + auVar160._4_4_;
  auVar292._8_4_ = fVar200 * 0.0 + auVar160._8_4_;
  auVar292._12_4_ = fVar203 * 0.0 + auVar160._12_4_;
  auVar186._0_4_ = fVar184 * -0.0 + fVar204 * 0.0 + fVar117 + fVar202 * -0.0;
  auVar186._4_4_ = fVar197 * -0.0 + fVar226 * 0.0 + fVar118 + fVar247 * -0.0;
  auVar186._8_4_ = fVar199 * -0.0 + fVar228 * 0.0 + fVar119 + fVar229 * -0.0;
  auVar186._12_4_ = fVar201 * -0.0 + fVar231 * 0.0 + fVar120 + fVar267 * -0.0;
  auVar207._0_4_ = fVar117 * 0.0 + fVar202 * 0.5;
  auVar207._4_4_ = fVar118 * 0.0 + fVar247 * 0.5;
  auVar207._8_4_ = fVar119 * 0.0 + fVar229 * 0.5;
  auVar207._12_4_ = fVar120 * 0.0 + fVar267 * 0.5;
  auVar261._0_4_ = fVar204 * 0.5;
  auVar261._4_4_ = fVar226 * 0.5;
  auVar261._8_4_ = fVar228 * 0.5;
  auVar261._12_4_ = fVar231 * 0.5;
  auVar160 = vsubps_avx(auVar207,auVar261);
  auVar208._0_4_ = fVar184 * 0.0 + auVar160._0_4_;
  auVar208._4_4_ = fVar197 * 0.0 + auVar160._4_4_;
  auVar208._8_4_ = fVar199 * 0.0 + auVar160._8_4_;
  auVar208._12_4_ = fVar201 * 0.0 + auVar160._12_4_;
  auVar160 = vshufps_avx(auVar289,auVar289,0xc9);
  auVar311 = vshufps_avx(auVar358,auVar358,0xc9);
  fVar248 = auVar289._0_4_;
  auVar234._0_4_ = fVar248 * auVar311._0_4_;
  fVar284 = auVar289._4_4_;
  auVar234._4_4_ = fVar284 * auVar311._4_4_;
  fVar327 = auVar289._8_4_;
  auVar234._8_4_ = fVar327 * auVar311._8_4_;
  fVar285 = auVar289._12_4_;
  auVar234._12_4_ = fVar285 * auVar311._12_4_;
  auVar271._0_4_ = auVar358._0_4_ * auVar160._0_4_;
  auVar271._4_4_ = auVar358._4_4_ * auVar160._4_4_;
  auVar271._8_4_ = auVar358._8_4_ * auVar160._8_4_;
  auVar271._12_4_ = auVar358._12_4_ * auVar160._12_4_;
  auVar311 = vsubps_avx(auVar271,auVar234);
  auVar18 = vshufps_avx(auVar311,auVar311,0xc9);
  auVar311 = vshufps_avx(auVar276,auVar276,0xc9);
  auVar272._0_4_ = auVar311._0_4_ * fVar248;
  auVar272._4_4_ = auVar311._4_4_ * fVar284;
  auVar272._8_4_ = auVar311._8_4_ * fVar327;
  auVar272._12_4_ = auVar311._12_4_ * fVar285;
  auVar82._0_4_ = auVar160._0_4_ * auVar276._0_4_;
  auVar82._4_4_ = auVar160._4_4_ * auVar276._4_4_;
  auVar82._8_4_ = auVar160._8_4_ * auVar276._8_4_;
  auVar82._12_4_ = auVar160._12_4_ * auVar276._12_4_;
  auVar160 = vsubps_avx(auVar82,auVar272);
  auVar276 = vshufps_avx(auVar160,auVar160,0xc9);
  auVar160 = vshufps_avx(auVar292,auVar292,0xc9);
  auVar311 = vshufps_avx(auVar186,auVar186,0xc9);
  auVar273._0_4_ = auVar292._0_4_ * auVar311._0_4_;
  auVar273._4_4_ = auVar292._4_4_ * auVar311._4_4_;
  auVar273._8_4_ = auVar292._8_4_ * auVar311._8_4_;
  auVar273._12_4_ = auVar292._12_4_ * auVar311._12_4_;
  auVar187._0_4_ = auVar160._0_4_ * auVar186._0_4_;
  auVar187._4_4_ = auVar160._4_4_ * auVar186._4_4_;
  auVar187._8_4_ = auVar160._8_4_ * auVar186._8_4_;
  auVar187._12_4_ = auVar160._12_4_ * auVar186._12_4_;
  auVar311 = vsubps_avx(auVar187,auVar273);
  auVar15 = vshufps_avx(auVar311,auVar311,0xc9);
  auVar311 = vshufps_avx(auVar208,auVar208,0xc9);
  auVar274._0_4_ = auVar292._0_4_ * auVar311._0_4_;
  auVar274._4_4_ = auVar292._4_4_ * auVar311._4_4_;
  auVar274._8_4_ = auVar292._8_4_ * auVar311._8_4_;
  auVar274._12_4_ = auVar292._12_4_ * auVar311._12_4_;
  auVar209._0_4_ = auVar160._0_4_ * auVar208._0_4_;
  auVar209._4_4_ = auVar160._4_4_ * auVar208._4_4_;
  auVar209._8_4_ = auVar160._8_4_ * auVar208._8_4_;
  auVar209._12_4_ = auVar160._12_4_ * auVar208._12_4_;
  auVar160 = vsubps_avx(auVar209,auVar274);
  auVar159 = vshufps_avx(auVar160,auVar160,0xc9);
  auVar160 = vdpps_avx(auVar18,auVar18,0x7f);
  fVar198 = auVar160._0_4_;
  auVar275 = ZEXT416((uint)fVar198);
  auVar311 = vrsqrtss_avx(auVar275,auVar275);
  fVar196 = auVar311._0_4_;
  auVar311 = vdpps_avx(auVar18,auVar276,0x7f);
  auVar210 = ZEXT416((uint)(fVar196 * 1.5 - fVar198 * 0.5 * fVar196 * fVar196 * fVar196));
  auVar210 = vshufps_avx(auVar210,auVar210,0);
  fVar204 = auVar210._0_4_ * auVar18._0_4_;
  fVar226 = auVar210._4_4_ * auVar18._4_4_;
  fVar228 = auVar210._8_4_ * auVar18._8_4_;
  fVar231 = auVar210._12_4_ * auVar18._12_4_;
  auVar160 = vshufps_avx(auVar160,auVar160,0);
  auVar83._0_4_ = auVar160._0_4_ * auVar276._0_4_;
  auVar83._4_4_ = auVar160._4_4_ * auVar276._4_4_;
  auVar83._8_4_ = auVar160._8_4_ * auVar276._8_4_;
  auVar83._12_4_ = auVar160._12_4_ * auVar276._12_4_;
  auVar160 = vshufps_avx(auVar311,auVar311,0);
  auVar235._0_4_ = auVar160._0_4_ * auVar18._0_4_;
  auVar235._4_4_ = auVar160._4_4_ * auVar18._4_4_;
  auVar235._8_4_ = auVar160._8_4_ * auVar18._8_4_;
  auVar235._12_4_ = auVar160._12_4_ * auVar18._12_4_;
  auVar19 = vsubps_avx(auVar83,auVar235);
  auVar160 = vrcpss_avx(auVar275,auVar275);
  auVar160 = ZEXT416((uint)(auVar160._0_4_ * (2.0 - fVar198 * auVar160._0_4_)));
  auVar18 = vshufps_avx(auVar160,auVar160,0);
  auVar160 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar117 = auVar160._0_4_;
  auVar276 = ZEXT416((uint)fVar117);
  auVar311 = vrsqrtss_avx(auVar276,auVar276);
  fVar184 = auVar311._0_4_;
  auVar311 = vdpps_avx(auVar15,auVar159,0x7f);
  auVar160 = vshufps_avx(auVar160,auVar160,0);
  auVar359._0_4_ = auVar159._0_4_ * auVar160._0_4_;
  auVar359._4_4_ = auVar159._4_4_ * auVar160._4_4_;
  auVar359._8_4_ = auVar159._8_4_ * auVar160._8_4_;
  auVar359._12_4_ = auVar159._12_4_ * auVar160._12_4_;
  lVar11 = *(long *)(_Var9 + 0x38 + lVar72);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar72);
  pfVar3 = (float *)(lVar11 + lVar12 * uVar68);
  fVar196 = *pfVar3;
  fVar198 = pfVar3[1];
  fVar200 = pfVar3[2];
  fVar203 = pfVar3[3];
  pfVar3 = (float *)(lVar11 + lVar12 * lVar70);
  fVar225 = *pfVar3;
  fVar227 = pfVar3[1];
  fVar230 = pfVar3[2];
  fVar232 = pfVar3[3];
  pfVar3 = (float *)(lVar11 + lVar12 * lVar1);
  fVar244 = *pfVar3;
  fVar245 = pfVar3[1];
  fVar246 = pfVar3[2];
  fVar74 = pfVar3[3];
  auVar160 = vshufps_avx(auVar311,auVar311,0);
  auVar84._0_4_ = auVar160._0_4_ * auVar15._0_4_;
  auVar84._4_4_ = auVar160._4_4_ * auVar15._4_4_;
  auVar84._8_4_ = auVar160._8_4_ * auVar15._8_4_;
  auVar84._12_4_ = auVar160._12_4_ * auVar15._12_4_;
  auVar159 = vsubps_avx(auVar359,auVar84);
  pfVar3 = (float *)(lVar11 + lVar12 * lVar2);
  fVar75 = *pfVar3;
  fVar76 = pfVar3[1];
  fVar115 = pfVar3[2];
  fVar116 = pfVar3[3];
  lVar11 = *(long *)(lVar10 + 0x38 + lVar72);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar72);
  auVar160 = ZEXT416((uint)(fVar184 * 1.5 - fVar117 * 0.5 * fVar184 * fVar184 * fVar184));
  auVar311 = vshufps_avx(auVar160,auVar160,0);
  fVar184 = auVar311._0_4_ * auVar15._0_4_;
  fVar197 = auVar311._4_4_ * auVar15._4_4_;
  fVar199 = auVar311._8_4_ * auVar15._8_4_;
  fVar201 = auVar311._12_4_ * auVar15._12_4_;
  auVar160 = vrcpss_avx(auVar276,auVar276);
  auVar160 = ZEXT416((uint)(auVar160._0_4_ * (2.0 - auVar160._0_4_ * fVar117)));
  auVar160 = vshufps_avx(auVar160,auVar160,0);
  auVar276 = vshufps_avx(_local_5c8,_local_5c8,0xff);
  auVar328._0_4_ = auVar276._0_4_ * fVar204;
  auVar328._4_4_ = auVar276._4_4_ * fVar226;
  auVar328._8_4_ = auVar276._8_4_ * fVar228;
  auVar328._12_4_ = auVar276._12_4_ * fVar231;
  auVar15 = vshufps_avx(auVar289,auVar289,0xff);
  auVar275 = vsubps_avx(_local_5c8,auVar328);
  auVar262._0_4_ =
       auVar15._0_4_ * fVar204 + auVar276._0_4_ * auVar210._0_4_ * auVar19._0_4_ * auVar18._0_4_;
  auVar262._4_4_ =
       auVar15._4_4_ * fVar226 + auVar276._4_4_ * auVar210._4_4_ * auVar19._4_4_ * auVar18._4_4_;
  auVar262._8_4_ =
       auVar15._8_4_ * fVar228 + auVar276._8_4_ * auVar210._8_4_ * auVar19._8_4_ * auVar18._8_4_;
  auVar262._12_4_ =
       auVar15._12_4_ * fVar231 +
       auVar276._12_4_ * auVar210._12_4_ * auVar19._12_4_ * auVar18._12_4_;
  auVar19 = vsubps_avx(auVar289,auVar262);
  local_5c8._0_4_ = auVar328._0_4_ + (float)local_5c8._0_4_;
  local_5c8._4_4_ = auVar328._4_4_ + (float)local_5c8._4_4_;
  fStack_5c0 = auVar328._8_4_ + fStack_5c0;
  fStack_5bc = auVar328._12_4_ + fStack_5bc;
  auVar18 = vshufps_avx((undefined1  [16])p00.field_0,(undefined1  [16])p00.field_0,0xff);
  auVar155._0_4_ = auVar18._0_4_ * fVar184;
  auVar155._4_4_ = auVar18._4_4_ * fVar197;
  auVar155._8_4_ = auVar18._8_4_ * fVar199;
  auVar155._12_4_ = auVar18._12_4_ * fVar201;
  auVar276 = vshufps_avx(auVar292,auVar292,0xff);
  auVar16 = vsubps_avx((undefined1  [16])p00.field_0,auVar155);
  auVar85._0_4_ =
       auVar276._0_4_ * fVar184 + auVar18._0_4_ * auVar311._0_4_ * auVar159._0_4_ * auVar160._0_4_;
  auVar85._4_4_ =
       auVar276._4_4_ * fVar197 + auVar18._4_4_ * auVar311._4_4_ * auVar159._4_4_ * auVar160._4_4_;
  auVar85._8_4_ =
       auVar276._8_4_ * fVar199 + auVar18._8_4_ * auVar311._8_4_ * auVar159._8_4_ * auVar160._8_4_;
  auVar85._12_4_ =
       auVar276._12_4_ * fVar201 +
       auVar18._12_4_ * auVar311._12_4_ * auVar159._12_4_ * auVar160._12_4_;
  auVar17 = vsubps_avx(auVar292,auVar85);
  p00.field_0.v[0] = p00.field_0.v[0] + auVar155._0_4_;
  p00.field_0.v[1] = p00.field_0.v[1] + auVar155._4_4_;
  p00.field_0.v[2] = p00.field_0.v[2] + auVar155._8_4_;
  p00.field_0.v[3] = p00.field_0.v[3] + auVar155._12_4_;
  auVar86._0_4_ = fVar225 * 0.0 + fVar244 * 0.5 + fVar75 * 0.0;
  auVar86._4_4_ = fVar227 * 0.0 + fVar245 * 0.5 + fVar76 * 0.0;
  auVar86._8_4_ = fVar230 * 0.0 + fVar246 * 0.5 + fVar115 * 0.0;
  auVar86._12_4_ = fVar232 * 0.0 + fVar74 * 0.5 + fVar116 * 0.0;
  auVar123._0_4_ = fVar196 * 0.5;
  auVar123._4_4_ = fVar198 * 0.5;
  auVar123._8_4_ = fVar200 * 0.5;
  auVar123._12_4_ = fVar203 * 0.5;
  auVar77 = vsubps_avx(auVar86,auVar123);
  pfVar3 = (float *)(lVar11 + lVar1 * lVar10);
  fVar184 = *pfVar3;
  fVar197 = pfVar3[1];
  fVar199 = pfVar3[2];
  fVar201 = pfVar3[3];
  auVar160 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar2);
  fVar202 = auVar160._0_4_;
  fVar247 = auVar160._4_4_;
  fVar229 = auVar160._8_4_;
  fVar267 = auVar160._12_4_;
  pfVar3 = (float *)(lVar11 + lVar70 * lVar10);
  fVar204 = *pfVar3;
  fVar226 = pfVar3[1];
  fVar228 = pfVar3[2];
  fVar231 = pfVar3[3];
  auVar249._0_4_ = fVar204 * 0.0 + fVar202 * 0.0 + fVar184 * 0.5;
  auVar249._4_4_ = fVar226 * 0.0 + fVar247 * 0.0 + fVar197 * 0.5;
  auVar249._8_4_ = fVar228 * 0.0 + fVar229 * 0.0 + fVar199 * 0.5;
  auVar249._12_4_ = fVar231 * 0.0 + fVar267 * 0.0 + fVar201 * 0.5;
  pfVar3 = (float *)(lVar11 + uVar68 * lVar10);
  fVar117 = *pfVar3;
  fVar118 = pfVar3[1];
  fVar119 = pfVar3[2];
  fVar120 = pfVar3[3];
  auVar277._0_4_ = fVar117 * 0.5;
  auVar277._4_4_ = fVar118 * 0.5;
  auVar277._8_4_ = fVar119 * 0.5;
  auVar277._12_4_ = fVar120 * 0.5;
  auVar311 = vsubps_avx(auVar249,auVar277);
  auVar278._0_4_ = fVar196 * -0.0 + fVar225 + fVar244 * 0.0 + fVar75 * -0.0;
  auVar278._4_4_ = fVar198 * -0.0 + fVar227 + fVar245 * 0.0 + fVar76 * -0.0;
  auVar278._8_4_ = fVar200 * -0.0 + fVar230 + fVar246 * 0.0 + fVar115 * -0.0;
  auVar278._12_4_ = fVar203 * -0.0 + fVar232 + fVar74 * 0.0 + fVar116 * -0.0;
  local_568._0_4_ = fVar196 * -0.0 + fVar225 * 0.0 + fVar244 + fVar75 * -0.0;
  local_568._4_4_ = fVar198 * -0.0 + fVar227 * 0.0 + fVar245 + fVar76 * -0.0;
  fStack_560 = fVar200 * -0.0 + fVar230 * 0.0 + fVar246 + fVar115 * -0.0;
  fStack_55c = fVar203 * -0.0 + fVar232 * 0.0 + fVar74 + fVar116 * -0.0;
  auVar307._0_4_ = fVar244 * 0.0 + fVar75 * 0.5;
  auVar307._4_4_ = fVar245 * 0.0 + fVar76 * 0.5;
  auVar307._8_4_ = fVar246 * 0.0 + fVar115 * 0.5;
  auVar307._12_4_ = fVar74 * 0.0 + fVar116 * 0.5;
  auVar329._0_4_ = fVar225 * 0.5;
  auVar329._4_4_ = fVar227 * 0.5;
  auVar329._8_4_ = fVar230 * 0.5;
  auVar329._12_4_ = fVar232 * 0.5;
  auVar160 = vsubps_avx(auVar307,auVar329);
  auVar320._0_4_ = fVar196 * 0.0 + auVar160._0_4_;
  auVar320._4_4_ = fVar198 * 0.0 + auVar160._4_4_;
  auVar320._8_4_ = fVar200 * 0.0 + auVar160._8_4_;
  auVar320._12_4_ = fVar203 * 0.0 + auVar160._12_4_;
  auVar308._0_4_ = fVar117 * -0.0 + fVar204 + fVar202 * -0.0 + fVar184 * 0.0;
  auVar308._4_4_ = fVar118 * -0.0 + fVar226 + fVar247 * -0.0 + fVar197 * 0.0;
  auVar308._8_4_ = fVar119 * -0.0 + fVar228 + fVar229 * -0.0 + fVar199 * 0.0;
  auVar308._12_4_ = fVar120 * -0.0 + fVar231 + fVar267 * -0.0 + fVar201 * 0.0;
  auVar124._0_4_ = fVar117 * -0.0 + fVar202 * -0.0 + fVar184 + fVar204 * 0.0;
  auVar124._4_4_ = fVar118 * -0.0 + fVar247 * -0.0 + fVar197 + fVar226 * 0.0;
  auVar124._8_4_ = fVar119 * -0.0 + fVar229 * -0.0 + fVar199 + fVar228 * 0.0;
  auVar124._12_4_ = fVar120 * -0.0 + fVar267 * -0.0 + fVar201 + fVar231 * 0.0;
  auVar156._0_4_ = fVar184 * 0.0 + fVar202 * 0.5;
  auVar156._4_4_ = fVar197 * 0.0 + fVar247 * 0.5;
  auVar156._8_4_ = fVar199 * 0.0 + fVar229 * 0.5;
  auVar156._12_4_ = fVar201 * 0.0 + fVar267 * 0.5;
  auVar188._0_4_ = fVar204 * 0.5;
  auVar188._4_4_ = fVar226 * 0.5;
  auVar188._8_4_ = fVar228 * 0.5;
  auVar188._12_4_ = fVar231 * 0.5;
  auVar160 = vsubps_avx(auVar156,auVar188);
  auVar157._0_4_ = fVar117 * 0.0 + auVar160._0_4_;
  auVar157._4_4_ = fVar118 * 0.0 + auVar160._4_4_;
  auVar157._8_4_ = fVar119 * 0.0 + auVar160._8_4_;
  auVar157._12_4_ = fVar120 * 0.0 + auVar160._12_4_;
  auVar160 = vshufps_avx(auVar308,auVar308,0xc9);
  fVar244 = auVar77._0_4_;
  auVar87._0_4_ = fVar244 * auVar160._0_4_;
  fVar245 = auVar77._4_4_;
  auVar87._4_4_ = fVar245 * auVar160._4_4_;
  fVar246 = auVar77._8_4_;
  auVar87._8_4_ = fVar246 * auVar160._8_4_;
  fVar76 = auVar77._12_4_;
  auVar87._12_4_ = fVar76 * auVar160._12_4_;
  auVar160 = vshufps_avx(auVar77,auVar77,0xc9);
  auVar309._0_4_ = auVar308._0_4_ * auVar160._0_4_;
  auVar309._4_4_ = auVar308._4_4_ * auVar160._4_4_;
  auVar309._8_4_ = auVar308._8_4_ * auVar160._8_4_;
  auVar309._12_4_ = auVar308._12_4_ * auVar160._12_4_;
  auVar18 = vsubps_avx(auVar309,auVar87);
  auVar88._0_4_ = auVar160._0_4_ * auVar311._0_4_;
  auVar88._4_4_ = auVar160._4_4_ * auVar311._4_4_;
  auVar88._8_4_ = auVar160._8_4_ * auVar311._8_4_;
  auVar88._12_4_ = auVar160._12_4_ * auVar311._12_4_;
  auVar160 = vshufps_avx(auVar311,auVar311,0xc9);
  auVar189._0_4_ = fVar244 * auVar160._0_4_;
  auVar189._4_4_ = fVar245 * auVar160._4_4_;
  auVar189._8_4_ = fVar246 * auVar160._8_4_;
  auVar189._12_4_ = fVar76 * auVar160._12_4_;
  auVar276 = vsubps_avx(auVar88,auVar189);
  auVar160 = vshufps_avx(auVar124,auVar124,0xc9);
  auVar89._0_4_ = auVar320._0_4_ * auVar160._0_4_;
  auVar89._4_4_ = auVar320._4_4_ * auVar160._4_4_;
  auVar89._8_4_ = auVar320._8_4_ * auVar160._8_4_;
  auVar89._12_4_ = auVar320._12_4_ * auVar160._12_4_;
  auVar160 = vshufps_avx(auVar320,auVar320,0xc9);
  auVar125._0_4_ = auVar160._0_4_ * auVar124._0_4_;
  auVar125._4_4_ = auVar160._4_4_ * auVar124._4_4_;
  auVar125._8_4_ = auVar160._8_4_ * auVar124._8_4_;
  auVar125._12_4_ = auVar160._12_4_ * auVar124._12_4_;
  auVar15 = vsubps_avx(auVar125,auVar89);
  auVar18 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar126._0_4_ = auVar160._0_4_ * auVar157._0_4_;
  auVar126._4_4_ = auVar160._4_4_ * auVar157._4_4_;
  auVar126._8_4_ = auVar160._8_4_ * auVar157._8_4_;
  auVar126._12_4_ = auVar160._12_4_ * auVar157._12_4_;
  auVar311 = vshufps_avx(auVar157,auVar157,0xc9);
  auVar160 = vdpps_avx(auVar18,auVar18,0x7f);
  auVar158._0_4_ = auVar320._0_4_ * auVar311._0_4_;
  auVar158._4_4_ = auVar320._4_4_ * auVar311._4_4_;
  auVar158._8_4_ = auVar320._8_4_ * auVar311._8_4_;
  auVar158._12_4_ = auVar320._12_4_ * auVar311._12_4_;
  auVar210 = vsubps_avx(auVar126,auVar158);
  auVar276 = vshufps_avx(auVar276,auVar276,0xc9);
  fVar198 = auVar160._0_4_;
  auVar159 = ZEXT416((uint)fVar198);
  auVar311 = vrsqrtss_avx(auVar159,auVar159);
  fVar196 = auVar311._0_4_;
  auVar311 = vdpps_avx(auVar18,auVar276,0x7f);
  auVar160 = vshufps_avx(auVar160,auVar160,0);
  auVar127._0_4_ = auVar160._0_4_ * auVar276._0_4_;
  auVar127._4_4_ = auVar160._4_4_ * auVar276._4_4_;
  auVar127._8_4_ = auVar160._8_4_ * auVar276._8_4_;
  auVar127._12_4_ = auVar160._12_4_ * auVar276._12_4_;
  auVar160 = vshufps_avx(auVar311,auVar311,0);
  auVar310._0_4_ = auVar160._0_4_ * auVar18._0_4_;
  auVar310._4_4_ = auVar160._4_4_ * auVar18._4_4_;
  auVar310._8_4_ = auVar160._8_4_ * auVar18._8_4_;
  auVar310._12_4_ = auVar160._12_4_ * auVar18._12_4_;
  auVar78 = vsubps_avx(auVar127,auVar310);
  auVar160 = vrcpss_avx(auVar159,auVar159);
  auVar160 = ZEXT416((uint)(auVar160._0_4_ * (2.0 - fVar198 * auVar160._0_4_)));
  auVar276 = vshufps_avx(auVar160,auVar160,0);
  auVar15 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar160 = ZEXT416((uint)(fVar196 * 1.5 - fVar198 * 0.5 * fVar196 * fVar196 * fVar196));
  auVar159 = vshufps_avx(auVar160,auVar160,0);
  auVar311 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar196 = auVar18._0_4_ * auVar159._0_4_;
  fVar198 = auVar18._4_4_ * auVar159._4_4_;
  fVar200 = auVar18._8_4_ * auVar159._8_4_;
  fVar203 = auVar18._12_4_ * auVar159._12_4_;
  auVar210 = vshufps_avx(auVar210,auVar210,0xc9);
  auVar160 = vblendps_avx(auVar311,_DAT_01f45a50,0xe);
  auVar18 = vrsqrtss_avx(auVar160,auVar160);
  fVar225 = auVar18._0_4_;
  auVar18 = vdpps_avx(auVar15,auVar210,0x7f);
  auVar289 = vshufps_avx(auVar311,auVar311,0);
  auVar161._0_4_ = auVar289._0_4_ * auVar210._0_4_;
  auVar161._4_4_ = auVar289._4_4_ * auVar210._4_4_;
  auVar161._8_4_ = auVar289._8_4_ * auVar210._8_4_;
  auVar161._12_4_ = auVar289._12_4_ * auVar210._12_4_;
  auVar18 = vshufps_avx(auVar18,auVar18,0);
  auVar330._0_4_ = auVar18._0_4_ * auVar15._0_4_;
  auVar330._4_4_ = auVar18._4_4_ * auVar15._4_4_;
  auVar330._8_4_ = auVar18._8_4_ * auVar15._8_4_;
  auVar330._12_4_ = auVar18._12_4_ * auVar15._12_4_;
  auVar210 = vsubps_avx(auVar161,auVar330);
  auVar160 = vrcpss_avx(auVar160,auVar160);
  auVar160 = ZEXT416((uint)(auVar160._0_4_ * (2.0 - auVar311._0_4_ * auVar160._0_4_)));
  auVar160 = vshufps_avx(auVar160,auVar160,0);
  auVar311 = ZEXT416((uint)(fVar225 * 1.5 - auVar311._0_4_ * 0.5 * fVar225 * fVar225 * fVar225));
  auVar311 = vshufps_avx(auVar311,auVar311,0);
  fVar225 = auVar15._0_4_ * auVar311._0_4_;
  fVar227 = auVar15._4_4_ * auVar311._4_4_;
  fVar230 = auVar15._8_4_ * auVar311._8_4_;
  fVar232 = auVar15._12_4_ * auVar311._12_4_;
  auVar18 = vshufps_avx(auVar77,auVar77,0xff);
  auVar15 = vshufps_avx(auVar278,auVar278,0xff);
  auVar90._0_4_ = auVar15._0_4_ * fVar196;
  auVar90._4_4_ = auVar15._4_4_ * fVar198;
  auVar90._8_4_ = auVar15._8_4_ * fVar200;
  auVar90._12_4_ = auVar15._12_4_ * fVar203;
  auVar128._0_4_ =
       auVar18._0_4_ * fVar196 + auVar15._0_4_ * auVar159._0_4_ * auVar78._0_4_ * auVar276._0_4_;
  auVar128._4_4_ =
       auVar18._4_4_ * fVar198 + auVar15._4_4_ * auVar159._4_4_ * auVar78._4_4_ * auVar276._4_4_;
  auVar128._8_4_ =
       auVar18._8_4_ * fVar200 + auVar15._8_4_ * auVar159._8_4_ * auVar78._8_4_ * auVar276._8_4_;
  auVar128._12_4_ =
       auVar18._12_4_ * fVar203 +
       auVar15._12_4_ * auVar159._12_4_ * auVar78._12_4_ * auVar276._12_4_;
  auVar15 = vsubps_avx(auVar278,auVar90);
  auVar159 = vsubps_avx(auVar77,auVar128);
  auVar18 = vshufps_avx(auVar320,auVar320,0xff);
  auVar276 = vshufps_avx(_local_568,_local_568,0xff);
  auVar250._0_4_ = auVar276._0_4_ * fVar225;
  auVar250._4_4_ = auVar276._4_4_ * fVar227;
  auVar250._8_4_ = auVar276._8_4_ * fVar230;
  auVar250._12_4_ = auVar276._12_4_ * fVar232;
  auVar129._0_4_ =
       auVar18._0_4_ * fVar225 + auVar276._0_4_ * auVar311._0_4_ * auVar210._0_4_ * auVar160._0_4_;
  auVar129._4_4_ =
       auVar18._4_4_ * fVar227 + auVar276._4_4_ * auVar311._4_4_ * auVar210._4_4_ * auVar160._4_4_;
  auVar129._8_4_ =
       auVar18._8_4_ * fVar230 + auVar276._8_4_ * auVar311._8_4_ * auVar210._8_4_ * auVar160._8_4_;
  auVar129._12_4_ =
       auVar18._12_4_ * fVar232 +
       auVar276._12_4_ * auVar311._12_4_ * auVar210._12_4_ * auVar160._12_4_;
  auVar18 = vsubps_avx(_local_568,auVar250);
  auVar343._0_4_ = (float)local_568._0_4_ + auVar250._0_4_;
  auVar343._4_4_ = (float)local_568._4_4_ + auVar250._4_4_;
  auVar343._8_4_ = fStack_560 + auVar250._8_4_;
  auVar343._12_4_ = fStack_55c + auVar250._12_4_;
  auVar276 = vsubps_avx(auVar320,auVar129);
  local_508 = auVar19._0_4_;
  fStack_504 = auVar19._4_4_;
  fStack_500 = auVar19._8_4_;
  fStack_4fc = auVar19._12_4_;
  local_468 = auVar275._0_4_;
  fStack_464 = auVar275._4_4_;
  fStack_460 = auVar275._8_4_;
  fStack_45c = auVar275._12_4_;
  auVar160 = vshufps_avx(ZEXT416((uint)fVar183),ZEXT416((uint)fVar183),0);
  auVar311 = vshufps_avx(ZEXT416((uint)(1.0 - fVar183)),ZEXT416((uint)(1.0 - fVar183)),0);
  fVar203 = auVar160._0_4_;
  fVar225 = auVar160._4_4_;
  fVar227 = auVar160._8_4_;
  fVar230 = auVar160._12_4_;
  fVar183 = auVar311._0_4_;
  fVar196 = auVar311._4_4_;
  fVar198 = auVar311._8_4_;
  fVar200 = auVar311._12_4_;
  auVar293._0_4_ = fVar183 * local_468 + fVar203 * auVar15._0_4_;
  auVar293._4_4_ = fVar196 * fStack_464 + fVar225 * auVar15._4_4_;
  auVar293._8_4_ = fVar198 * fStack_460 + fVar227 * auVar15._8_4_;
  auVar293._12_4_ = fVar200 * fStack_45c + fVar230 * auVar15._12_4_;
  fVar74 = fVar183 * (local_468 + local_508 * 0.33333334) +
           fVar203 * (auVar15._0_4_ + auVar159._0_4_ * 0.33333334);
  fVar115 = fVar196 * (fStack_464 + fStack_504 * 0.33333334) +
            fVar225 * (auVar15._4_4_ + auVar159._4_4_ * 0.33333334);
  fVar197 = fVar198 * (fStack_460 + fStack_500 * 0.33333334) +
            fVar227 * (auVar15._8_4_ + auVar159._8_4_ * 0.33333334);
  fVar204 = fVar200 * (fStack_45c + fStack_4fc * 0.33333334) +
            fVar230 * (auVar15._12_4_ + auVar159._12_4_ * 0.33333334);
  local_5a8 = auVar17._0_4_;
  fStack_5a4 = auVar17._4_4_;
  fStack_5a0 = auVar17._8_4_;
  fStack_59c = auVar17._12_4_;
  auVar190._0_4_ = local_5a8 * 0.33333334;
  auVar190._4_4_ = fStack_5a4 * 0.33333334;
  auVar190._8_4_ = fStack_5a0 * 0.33333334;
  auVar190._12_4_ = fStack_59c * 0.33333334;
  auVar160 = vsubps_avx(auVar16,auVar190);
  auVar251._0_4_ = (auVar292._0_4_ + auVar85._0_4_) * 0.33333334;
  auVar251._4_4_ = (auVar292._4_4_ + auVar85._4_4_) * 0.33333334;
  auVar251._8_4_ = (auVar292._8_4_ + auVar85._8_4_) * 0.33333334;
  auVar251._12_4_ = (auVar292._12_4_ + auVar85._12_4_) * 0.33333334;
  auVar311 = vsubps_avx((undefined1  [16])p00.field_0,auVar251);
  auVar162._0_4_ = auVar276._0_4_ * 0.33333334;
  auVar162._4_4_ = auVar276._4_4_ * 0.33333334;
  auVar162._8_4_ = auVar276._8_4_ * 0.33333334;
  auVar162._12_4_ = auVar276._12_4_ * 0.33333334;
  auVar276 = vsubps_avx(auVar18,auVar162);
  auVar312._0_4_ = (auVar320._0_4_ + auVar129._0_4_) * 0.33333334;
  auVar312._4_4_ = (auVar320._4_4_ + auVar129._4_4_) * 0.33333334;
  auVar312._8_4_ = (auVar320._8_4_ + auVar129._8_4_) * 0.33333334;
  auVar312._12_4_ = (auVar320._12_4_ + auVar129._12_4_) * 0.33333334;
  auVar15 = vsubps_avx(auVar343,auVar312);
  auVar321._0_4_ = fVar183 * auVar160._0_4_ + fVar203 * auVar276._0_4_;
  auVar321._4_4_ = fVar196 * auVar160._4_4_ + fVar225 * auVar276._4_4_;
  auVar321._8_4_ = fVar198 * auVar160._8_4_ + fVar227 * auVar276._8_4_;
  auVar321._12_4_ = fVar200 * auVar160._12_4_ + fVar230 * auVar276._12_4_;
  fVar75 = fVar203 * auVar18._0_4_ + fVar183 * auVar16._0_4_;
  fVar116 = fVar225 * auVar18._4_4_ + fVar196 * auVar16._4_4_;
  fVar199 = fVar227 * auVar18._8_4_ + fVar198 * auVar16._8_4_;
  fVar226 = fVar230 * auVar18._12_4_ + fVar200 * auVar16._12_4_;
  auVar313._0_4_ = (float)local_5c8._0_4_ * fVar183 + fVar203 * (auVar278._0_4_ + auVar90._0_4_);
  auVar313._4_4_ = (float)local_5c8._4_4_ * fVar196 + fVar225 * (auVar278._4_4_ + auVar90._4_4_);
  auVar313._8_4_ = fStack_5c0 * fVar198 + fVar227 * (auVar278._8_4_ + auVar90._8_4_);
  auVar313._12_4_ = fStack_5bc * fVar200 + fVar230 * (auVar278._12_4_ + auVar90._12_4_);
  auVar331._0_4_ =
       fVar183 * ((float)local_5c8._0_4_ + (fVar248 + auVar262._0_4_) * 0.33333334) +
       fVar203 * (auVar278._0_4_ + auVar90._0_4_ + (fVar244 + auVar128._0_4_) * 0.33333334);
  auVar331._4_4_ =
       fVar196 * ((float)local_5c8._4_4_ + (fVar284 + auVar262._4_4_) * 0.33333334) +
       fVar225 * (auVar278._4_4_ + auVar90._4_4_ + (fVar245 + auVar128._4_4_) * 0.33333334);
  auVar331._8_4_ =
       fVar198 * (fStack_5c0 + (fVar327 + auVar262._8_4_) * 0.33333334) +
       fVar227 * (auVar278._8_4_ + auVar90._8_4_ + (fVar246 + auVar128._8_4_) * 0.33333334);
  auVar331._12_4_ =
       fVar200 * (fStack_5bc + (fVar285 + auVar262._12_4_) * 0.33333334) +
       fVar230 * (auVar278._12_4_ + auVar90._12_4_ + (fVar76 + auVar128._12_4_) * 0.33333334);
  fVar76 = fVar183 * auVar311._0_4_ + fVar203 * auVar15._0_4_;
  fVar184 = fVar196 * auVar311._4_4_ + fVar225 * auVar15._4_4_;
  fVar201 = fVar198 * auVar311._8_4_ + fVar227 * auVar15._8_4_;
  fVar228 = fVar200 * auVar311._12_4_ + fVar230 * auVar15._12_4_;
  auVar160 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar160 = vinsertps_avx(auVar160,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar360._0_4_ = p00.field_0.v[0] * fVar183 + fVar203 * auVar343._0_4_;
  auVar360._4_4_ = p00.field_0.v[1] * fVar196 + fVar225 * auVar343._4_4_;
  auVar360._8_4_ = p00.field_0.v[2] * fVar198 + fVar227 * auVar343._8_4_;
  auVar360._12_4_ = p00.field_0.v[3] * fVar200 + fVar230 * auVar343._12_4_;
  auVar289 = vsubps_avx(auVar293,auVar160);
  auVar18 = vmovsldup_avx(auVar289);
  auVar311 = vmovshdup_avx(auVar289);
  auVar276 = vshufps_avx(auVar289,auVar289,0xaa);
  fVar183 = pre->ray_space[k].vx.field_0.m128[0];
  fVar196 = pre->ray_space[k].vx.field_0.m128[1];
  fVar198 = pre->ray_space[k].vx.field_0.m128[2];
  fVar200 = pre->ray_space[k].vx.field_0.m128[3];
  fVar203 = pre->ray_space[k].vy.field_0.m128[0];
  fVar225 = pre->ray_space[k].vy.field_0.m128[1];
  fVar227 = pre->ray_space[k].vy.field_0.m128[2];
  fVar230 = pre->ray_space[k].vy.field_0.m128[3];
  fVar232 = pre->ray_space[k].vz.field_0.m128[0];
  fVar244 = pre->ray_space[k].vz.field_0.m128[1];
  fVar245 = pre->ray_space[k].vz.field_0.m128[2];
  fVar246 = pre->ray_space[k].vz.field_0.m128[3];
  local_608._0_4_ = fVar183 * auVar18._0_4_ + fVar203 * auVar311._0_4_ + fVar232 * auVar276._0_4_;
  local_608._4_4_ = fVar196 * auVar18._4_4_ + fVar225 * auVar311._4_4_ + fVar244 * auVar276._4_4_;
  fStack_600 = fVar198 * auVar18._8_4_ + fVar227 * auVar311._8_4_ + fVar245 * auVar276._8_4_;
  fStack_5fc = fVar200 * auVar18._12_4_ + fVar230 * auVar311._12_4_ + fVar246 * auVar276._12_4_;
  auVar64._4_4_ = fVar115;
  auVar64._0_4_ = fVar74;
  auVar64._8_4_ = fVar197;
  auVar64._12_4_ = fVar204;
  auVar19 = vsubps_avx(auVar64,auVar160);
  auVar276 = vshufps_avx(auVar19,auVar19,0xaa);
  auVar311 = vmovshdup_avx(auVar19);
  auVar18 = vmovsldup_avx(auVar19);
  auVar344._0_4_ = fVar183 * auVar18._0_4_ + fVar203 * auVar311._0_4_ + fVar232 * auVar276._0_4_;
  auVar344._4_4_ = fVar196 * auVar18._4_4_ + fVar225 * auVar311._4_4_ + fVar244 * auVar276._4_4_;
  auVar344._8_4_ = fVar198 * auVar18._8_4_ + fVar227 * auVar311._8_4_ + fVar245 * auVar276._8_4_;
  auVar344._12_4_ = fVar200 * auVar18._12_4_ + fVar230 * auVar311._12_4_ + fVar246 * auVar276._12_4_
  ;
  auVar275 = vsubps_avx(auVar321,auVar160);
  auVar276 = vshufps_avx(auVar275,auVar275,0xaa);
  auVar311 = vmovshdup_avx(auVar275);
  auVar18 = vmovsldup_avx(auVar275);
  auVar211._0_4_ = fVar183 * auVar18._0_4_ + fVar203 * auVar311._0_4_ + fVar232 * auVar276._0_4_;
  auVar211._4_4_ = fVar196 * auVar18._4_4_ + fVar225 * auVar311._4_4_ + fVar244 * auVar276._4_4_;
  auVar211._8_4_ = fVar198 * auVar18._8_4_ + fVar227 * auVar311._8_4_ + fVar245 * auVar276._8_4_;
  auVar211._12_4_ = fVar200 * auVar18._12_4_ + fVar230 * auVar311._12_4_ + fVar246 * auVar276._12_4_
  ;
  auVar62._4_4_ = fVar116;
  auVar62._0_4_ = fVar75;
  auVar62._8_4_ = fVar199;
  auVar62._12_4_ = fVar226;
  auVar16 = vsubps_avx(auVar62,auVar160);
  auVar276 = vshufps_avx(auVar16,auVar16,0xaa);
  auVar311 = vmovshdup_avx(auVar16);
  auVar18 = vmovsldup_avx(auVar16);
  auVar350._0_4_ = auVar18._0_4_ * fVar183 + auVar311._0_4_ * fVar203 + fVar232 * auVar276._0_4_;
  auVar350._4_4_ = auVar18._4_4_ * fVar196 + auVar311._4_4_ * fVar225 + fVar244 * auVar276._4_4_;
  auVar350._8_4_ = auVar18._8_4_ * fVar198 + auVar311._8_4_ * fVar227 + fVar245 * auVar276._8_4_;
  auVar350._12_4_ = auVar18._12_4_ * fVar200 + auVar311._12_4_ * fVar230 + fVar246 * auVar276._12_4_
  ;
  auVar17 = vsubps_avx(auVar313,auVar160);
  auVar276 = vshufps_avx(auVar17,auVar17,0xaa);
  auVar311 = vmovshdup_avx(auVar17);
  auVar18 = vmovsldup_avx(auVar17);
  auVar279._0_4_ = auVar18._0_4_ * fVar183 + auVar311._0_4_ * fVar203 + auVar276._0_4_ * fVar232;
  auVar279._4_4_ = auVar18._4_4_ * fVar196 + auVar311._4_4_ * fVar225 + auVar276._4_4_ * fVar244;
  auVar279._8_4_ = auVar18._8_4_ * fVar198 + auVar311._8_4_ * fVar227 + auVar276._8_4_ * fVar245;
  auVar279._12_4_ = auVar18._12_4_ * fVar200 + auVar311._12_4_ * fVar230 + auVar276._12_4_ * fVar246
  ;
  auVar77 = vsubps_avx(auVar331,auVar160);
  auVar276 = vshufps_avx(auVar77,auVar77,0xaa);
  auVar311 = vmovshdup_avx(auVar77);
  auVar18 = vmovsldup_avx(auVar77);
  auVar294._0_4_ = auVar18._0_4_ * fVar183 + auVar311._0_4_ * fVar203 + auVar276._0_4_ * fVar232;
  auVar294._4_4_ = auVar18._4_4_ * fVar196 + auVar311._4_4_ * fVar225 + auVar276._4_4_ * fVar244;
  auVar294._8_4_ = auVar18._8_4_ * fVar198 + auVar311._8_4_ * fVar227 + auVar276._8_4_ * fVar245;
  auVar294._12_4_ = auVar18._12_4_ * fVar200 + auVar311._12_4_ * fVar230 + auVar276._12_4_ * fVar246
  ;
  auVar60._4_4_ = fVar184;
  auVar60._0_4_ = fVar76;
  auVar60._8_4_ = fVar201;
  auVar60._12_4_ = fVar228;
  auVar78 = vsubps_avx(auVar60,auVar160);
  auVar276 = vshufps_avx(auVar78,auVar78,0xaa);
  auVar311 = vmovshdup_avx(auVar78);
  auVar18 = vmovsldup_avx(auVar78);
  auVar314._0_4_ = auVar18._0_4_ * fVar183 + auVar311._0_4_ * fVar203 + auVar276._0_4_ * fVar232;
  auVar314._4_4_ = auVar18._4_4_ * fVar196 + auVar311._4_4_ * fVar225 + auVar276._4_4_ * fVar244;
  auVar314._8_4_ = auVar18._8_4_ * fVar198 + auVar311._8_4_ * fVar227 + auVar276._8_4_ * fVar245;
  auVar314._12_4_ = auVar18._12_4_ * fVar200 + auVar311._12_4_ * fVar230 + auVar276._12_4_ * fVar246
  ;
  auVar79 = vsubps_avx(auVar360,auVar160);
  auVar18 = vshufps_avx(auVar79,auVar79,0xaa);
  auVar160 = vmovshdup_avx(auVar79);
  auVar311 = vmovsldup_avx(auVar79);
  auVar91._0_4_ = fVar183 * auVar311._0_4_ + fVar203 * auVar160._0_4_ + fVar232 * auVar18._0_4_;
  auVar91._4_4_ = fVar196 * auVar311._4_4_ + fVar225 * auVar160._4_4_ + fVar244 * auVar18._4_4_;
  auVar91._8_4_ = fVar198 * auVar311._8_4_ + fVar227 * auVar160._8_4_ + fVar245 * auVar18._8_4_;
  auVar91._12_4_ = fVar200 * auVar311._12_4_ + fVar230 * auVar160._12_4_ + fVar246 * auVar18._12_4_;
  auVar276 = vmovlhps_avx(_local_608,auVar279);
  auVar15 = vmovlhps_avx(auVar344,auVar294);
  auVar159 = vmovlhps_avx(auVar211,auVar314);
  auVar210 = vmovlhps_avx(auVar350,auVar91);
  auVar160 = vminps_avx(auVar276,auVar15);
  auVar311 = vminps_avx(auVar159,auVar210);
  auVar18 = vminps_avx(auVar160,auVar311);
  auVar160 = vmaxps_avx(auVar276,auVar15);
  auVar311 = vmaxps_avx(auVar159,auVar210);
  auVar160 = vmaxps_avx(auVar160,auVar311);
  auVar311 = vshufpd_avx(auVar18,auVar18,3);
  auVar18 = vminps_avx(auVar18,auVar311);
  auVar311 = vshufpd_avx(auVar160,auVar160,3);
  auVar311 = vmaxps_avx(auVar160,auVar311);
  auVar252._8_4_ = 0x7fffffff;
  auVar252._0_8_ = 0x7fffffff7fffffff;
  auVar252._12_4_ = 0x7fffffff;
  auVar160 = vandps_avx(auVar18,auVar252);
  auVar311 = vandps_avx(auVar311,auVar252);
  auVar160 = vmaxps_avx(auVar160,auVar311);
  auVar311 = vmovshdup_avx(auVar160);
  auVar160 = vmaxss_avx(auVar311,auVar160);
  fVar196 = auVar160._0_4_ * 9.536743e-07;
  auVar160 = vshufps_avx(ZEXT416((uint)fVar196),ZEXT416((uint)fVar196),0);
  local_78._16_16_ = auVar160;
  local_78._0_16_ = auVar160;
  auVar92._0_8_ = auVar160._0_8_ ^ 0x8000000080000000;
  auVar92._8_4_ = auVar160._8_4_ ^ 0x80000000;
  auVar92._12_4_ = auVar160._12_4_ ^ 0x80000000;
  local_98._16_16_ = auVar92;
  local_98._0_16_ = auVar92;
  auVar160 = vpshufd_avx(ZEXT416(uVar67),0);
  auVar311 = vpshufd_avx(ZEXT416(uVar7),0);
  uVar68 = 0;
  fVar183 = *(float *)(ray + k * 4 + 0x30);
  auVar18 = vsubps_avx(auVar15,auVar276);
  auVar122 = vsubps_avx(auVar159,auVar15);
  auVar121 = vsubps_avx(auVar210,auVar159);
  auVar151 = vsubps_avx(auVar313,auVar293);
  auVar65._4_4_ = fVar115;
  auVar65._0_4_ = fVar74;
  auVar65._8_4_ = fVar197;
  auVar65._12_4_ = fVar204;
  auVar152 = vsubps_avx(auVar331,auVar65);
  auVar61._4_4_ = fVar184;
  auVar61._0_4_ = fVar76;
  auVar61._8_4_ = fVar201;
  auVar61._12_4_ = fVar228;
  auVar153 = vsubps_avx(auVar61,auVar321);
  auVar63._4_4_ = fVar116;
  auVar63._0_4_ = fVar75;
  auVar63._8_4_ = fVar199;
  auVar63._12_4_ = fVar226;
  auVar185 = vsubps_avx(auVar360,auVar63);
  auVar356 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar362 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_00948dc4:
  do {
    auVar290 = auVar362._0_16_;
    auVar269 = auVar356._0_16_;
    auVar96 = vshufps_avx(auVar269,auVar269,0x50);
    auVar351._8_4_ = 0x3f800000;
    auVar351._0_8_ = 0x3f8000003f800000;
    auVar351._12_4_ = 0x3f800000;
    auVar355._16_4_ = 0x3f800000;
    auVar355._0_16_ = auVar351;
    auVar355._20_4_ = 0x3f800000;
    auVar355._24_4_ = 0x3f800000;
    auVar355._28_4_ = 0x3f800000;
    auVar205 = vsubps_avx(auVar351,auVar96);
    fVar198 = auVar96._0_4_;
    fVar200 = auVar96._4_4_;
    fVar203 = auVar96._8_4_;
    fVar225 = auVar96._12_4_;
    fVar227 = auVar205._0_4_;
    fVar230 = auVar205._4_4_;
    fVar232 = auVar205._8_4_;
    fVar244 = auVar205._12_4_;
    auVar191._0_4_ = auVar279._0_4_ * fVar198 + fVar227 * (float)local_608._0_4_;
    auVar191._4_4_ = auVar279._4_4_ * fVar200 + fVar230 * (float)local_608._4_4_;
    auVar191._8_4_ = auVar279._0_4_ * fVar203 + fVar232 * (float)local_608._0_4_;
    auVar191._12_4_ = auVar279._4_4_ * fVar225 + fVar244 * (float)local_608._4_4_;
    auVar163._0_4_ = auVar294._0_4_ * fVar198 + auVar344._0_4_ * fVar227;
    auVar163._4_4_ = auVar294._4_4_ * fVar200 + auVar344._4_4_ * fVar230;
    auVar163._8_4_ = auVar294._0_4_ * fVar203 + auVar344._0_4_ * fVar232;
    auVar163._12_4_ = auVar294._4_4_ * fVar225 + auVar344._4_4_ * fVar244;
    auVar263._0_4_ = auVar314._0_4_ * fVar198 + auVar211._0_4_ * fVar227;
    auVar263._4_4_ = auVar314._4_4_ * fVar200 + auVar211._4_4_ * fVar230;
    auVar263._8_4_ = auVar314._0_4_ * fVar203 + auVar211._0_4_ * fVar232;
    auVar263._12_4_ = auVar314._4_4_ * fVar225 + auVar211._4_4_ * fVar244;
    auVar212._0_4_ = auVar91._0_4_ * fVar198 + auVar350._0_4_ * fVar227;
    auVar212._4_4_ = auVar91._4_4_ * fVar200 + auVar350._4_4_ * fVar230;
    auVar212._8_4_ = auVar91._0_4_ * fVar203 + auVar350._0_4_ * fVar232;
    auVar212._12_4_ = auVar91._4_4_ * fVar225 + auVar350._4_4_ * fVar244;
    auVar96 = vmovshdup_avx(auVar290);
    auVar205 = vshufps_avx(auVar290,auVar290,0);
    auVar298._16_16_ = auVar205;
    auVar298._0_16_ = auVar205;
    auVar180 = vshufps_avx(auVar290,auVar290,0x55);
    auVar110._16_16_ = auVar180;
    auVar110._0_16_ = auVar180;
    auVar109 = vsubps_avx(auVar110,auVar298);
    auVar180 = vshufps_avx(auVar191,auVar191,0);
    auVar144 = vshufps_avx(auVar191,auVar191,0x55);
    auVar132 = vshufps_avx(auVar163,auVar163,0);
    auVar166 = vshufps_avx(auVar163,auVar163,0x55);
    auVar133 = vshufps_avx(auVar263,auVar263,0);
    auVar259 = vshufps_avx(auVar263,auVar263,0x55);
    auVar260 = vshufps_avx(auVar212,auVar212,0);
    auVar268 = vshufps_avx(auVar212,auVar212,0x55);
    auVar96 = ZEXT416((uint)((auVar96._0_4_ - auVar362._0_4_) * 0.04761905));
    auVar96 = vshufps_avx(auVar96,auVar96,0);
    auVar318._0_4_ = auVar205._0_4_ + auVar109._0_4_ * 0.0;
    auVar318._4_4_ = auVar205._4_4_ + auVar109._4_4_ * 0.14285715;
    auVar318._8_4_ = auVar205._8_4_ + auVar109._8_4_ * 0.2857143;
    auVar318._12_4_ = auVar205._12_4_ + auVar109._12_4_ * 0.42857146;
    auVar318._16_4_ = auVar205._0_4_ + auVar109._16_4_ * 0.5714286;
    auVar318._20_4_ = auVar205._4_4_ + auVar109._20_4_ * 0.71428573;
    auVar318._24_4_ = auVar205._8_4_ + auVar109._24_4_ * 0.8571429;
    auVar318._28_4_ = auVar205._12_4_ + auVar109._28_4_;
    auVar20 = vsubps_avx(auVar355,auVar318);
    fVar198 = auVar132._0_4_;
    fVar203 = auVar132._4_4_;
    fVar227 = auVar132._8_4_;
    fVar232 = auVar132._12_4_;
    fVar288 = auVar20._0_4_;
    fVar300 = auVar20._4_4_;
    fVar301 = auVar20._8_4_;
    fVar302 = auVar20._12_4_;
    fVar303 = auVar20._16_4_;
    fVar304 = auVar20._20_4_;
    fVar305 = auVar20._24_4_;
    fVar284 = auVar166._0_4_;
    fVar285 = auVar166._4_4_;
    fVar286 = auVar166._8_4_;
    fVar287 = auVar166._12_4_;
    fVar346 = auVar144._12_4_ + 1.0;
    fVar247 = auVar133._0_4_;
    fVar229 = auVar133._4_4_;
    fVar267 = auVar133._8_4_;
    fVar248 = auVar133._12_4_;
    fVar245 = fVar247 * auVar318._0_4_ + fVar288 * fVar198;
    fVar246 = fVar229 * auVar318._4_4_ + fVar300 * fVar203;
    fVar231 = fVar267 * auVar318._8_4_ + fVar301 * fVar227;
    fVar117 = fVar248 * auVar318._12_4_ + fVar302 * fVar232;
    fVar118 = fVar247 * auVar318._16_4_ + fVar303 * fVar198;
    fVar119 = fVar229 * auVar318._20_4_ + fVar304 * fVar203;
    fVar120 = fVar267 * auVar318._24_4_ + fVar305 * fVar227;
    fVar200 = auVar259._0_4_;
    fVar225 = auVar259._4_4_;
    fVar230 = auVar259._8_4_;
    fVar244 = auVar259._12_4_;
    fVar327 = fVar284 * fVar288 + auVar318._0_4_ * fVar200;
    fVar334 = fVar285 * fVar300 + auVar318._4_4_ * fVar225;
    fVar335 = fVar286 * fVar301 + auVar318._8_4_ * fVar230;
    fVar336 = fVar287 * fVar302 + auVar318._12_4_ * fVar244;
    fVar337 = fVar284 * fVar303 + auVar318._16_4_ * fVar200;
    fVar338 = fVar285 * fVar304 + auVar318._20_4_ * fVar225;
    fVar339 = fVar286 * fVar305 + auVar318._24_4_ * fVar230;
    fVar340 = fVar287 + fVar232;
    auVar205 = vshufps_avx(auVar191,auVar191,0xaa);
    auVar132 = vshufps_avx(auVar191,auVar191,0xff);
    fVar202 = fVar248 + 0.0;
    auVar166 = vshufps_avx(auVar163,auVar163,0xaa);
    auVar133 = vshufps_avx(auVar163,auVar163,0xff);
    auVar223._0_4_ =
         fVar288 * (auVar318._0_4_ * fVar198 + fVar288 * auVar180._0_4_) + auVar318._0_4_ * fVar245;
    auVar223._4_4_ =
         fVar300 * (auVar318._4_4_ * fVar203 + fVar300 * auVar180._4_4_) + auVar318._4_4_ * fVar246;
    auVar223._8_4_ =
         fVar301 * (auVar318._8_4_ * fVar227 + fVar301 * auVar180._8_4_) + auVar318._8_4_ * fVar231;
    auVar223._12_4_ =
         fVar302 * (auVar318._12_4_ * fVar232 + fVar302 * auVar180._12_4_) +
         auVar318._12_4_ * fVar117;
    auVar223._16_4_ =
         fVar303 * (auVar318._16_4_ * fVar198 + fVar303 * auVar180._0_4_) +
         auVar318._16_4_ * fVar118;
    auVar223._20_4_ =
         fVar304 * (auVar318._20_4_ * fVar203 + fVar304 * auVar180._4_4_) +
         auVar318._20_4_ * fVar119;
    auVar223._24_4_ =
         fVar305 * (auVar318._24_4_ * fVar227 + fVar305 * auVar180._8_4_) +
         auVar318._24_4_ * fVar120;
    auVar223._28_4_ = auVar180._12_4_ + 1.0 + fVar244;
    auVar242._0_4_ =
         fVar288 * (fVar284 * auVar318._0_4_ + auVar144._0_4_ * fVar288) + auVar318._0_4_ * fVar327;
    auVar242._4_4_ =
         fVar300 * (fVar285 * auVar318._4_4_ + auVar144._4_4_ * fVar300) + auVar318._4_4_ * fVar334;
    auVar242._8_4_ =
         fVar301 * (fVar286 * auVar318._8_4_ + auVar144._8_4_ * fVar301) + auVar318._8_4_ * fVar335;
    auVar242._12_4_ =
         fVar302 * (fVar287 * auVar318._12_4_ + auVar144._12_4_ * fVar302) +
         auVar318._12_4_ * fVar336;
    auVar242._16_4_ =
         fVar303 * (fVar284 * auVar318._16_4_ + auVar144._0_4_ * fVar303) +
         auVar318._16_4_ * fVar337;
    auVar242._20_4_ =
         fVar304 * (fVar285 * auVar318._20_4_ + auVar144._4_4_ * fVar304) +
         auVar318._20_4_ * fVar338;
    auVar242._24_4_ =
         fVar305 * (fVar286 * auVar318._24_4_ + auVar144._8_4_ * fVar305) +
         auVar318._24_4_ * fVar339;
    auVar242._28_4_ = auVar268._12_4_ + fVar244;
    auVar111._0_4_ =
         fVar288 * fVar245 + auVar318._0_4_ * (fVar247 * fVar288 + auVar260._0_4_ * auVar318._0_4_);
    auVar111._4_4_ =
         fVar300 * fVar246 + auVar318._4_4_ * (fVar229 * fVar300 + auVar260._4_4_ * auVar318._4_4_);
    auVar111._8_4_ =
         fVar301 * fVar231 + auVar318._8_4_ * (fVar267 * fVar301 + auVar260._8_4_ * auVar318._8_4_);
    auVar111._12_4_ =
         fVar302 * fVar117 +
         auVar318._12_4_ * (fVar248 * fVar302 + auVar260._12_4_ * auVar318._12_4_);
    auVar111._16_4_ =
         fVar303 * fVar118 +
         auVar318._16_4_ * (fVar247 * fVar303 + auVar260._0_4_ * auVar318._16_4_);
    auVar111._20_4_ =
         fVar304 * fVar119 +
         auVar318._20_4_ * (fVar229 * fVar304 + auVar260._4_4_ * auVar318._20_4_);
    auVar111._24_4_ =
         fVar305 * fVar120 +
         auVar318._24_4_ * (fVar267 * fVar305 + auVar260._8_4_ * auVar318._24_4_);
    auVar111._28_4_ = fVar232 + 1.0 + fVar202;
    auVar326._0_4_ =
         fVar288 * fVar327 + auVar318._0_4_ * (auVar268._0_4_ * auVar318._0_4_ + fVar288 * fVar200);
    auVar326._4_4_ =
         fVar300 * fVar334 + auVar318._4_4_ * (auVar268._4_4_ * auVar318._4_4_ + fVar300 * fVar225);
    auVar326._8_4_ =
         fVar301 * fVar335 + auVar318._8_4_ * (auVar268._8_4_ * auVar318._8_4_ + fVar301 * fVar230);
    auVar326._12_4_ =
         fVar302 * fVar336 +
         auVar318._12_4_ * (auVar268._12_4_ * auVar318._12_4_ + fVar302 * fVar244);
    auVar326._16_4_ =
         fVar303 * fVar337 +
         auVar318._16_4_ * (auVar268._0_4_ * auVar318._16_4_ + fVar303 * fVar200);
    auVar326._20_4_ =
         fVar304 * fVar338 +
         auVar318._20_4_ * (auVar268._4_4_ * auVar318._20_4_ + fVar304 * fVar225);
    auVar326._24_4_ =
         fVar305 * fVar339 +
         auVar318._24_4_ * (auVar268._8_4_ * auVar318._24_4_ + fVar305 * fVar230);
    auVar326._28_4_ = fVar202 + fVar244 + 0.0;
    local_d8._0_4_ = fVar288 * auVar223._0_4_ + auVar318._0_4_ * auVar111._0_4_;
    local_d8._4_4_ = fVar300 * auVar223._4_4_ + auVar318._4_4_ * auVar111._4_4_;
    local_d8._8_4_ = fVar301 * auVar223._8_4_ + auVar318._8_4_ * auVar111._8_4_;
    local_d8._12_4_ = fVar302 * auVar223._12_4_ + auVar318._12_4_ * auVar111._12_4_;
    local_d8._16_4_ = fVar303 * auVar223._16_4_ + auVar318._16_4_ * auVar111._16_4_;
    local_d8._20_4_ = fVar304 * auVar223._20_4_ + auVar318._20_4_ * auVar111._20_4_;
    local_d8._24_4_ = fVar305 * auVar223._24_4_ + auVar318._24_4_ * auVar111._24_4_;
    local_d8._28_4_ = fVar340 + fVar244 + 0.0;
    auVar195._0_4_ = fVar288 * auVar242._0_4_ + auVar318._0_4_ * auVar326._0_4_;
    auVar195._4_4_ = fVar300 * auVar242._4_4_ + auVar318._4_4_ * auVar326._4_4_;
    auVar195._8_4_ = fVar301 * auVar242._8_4_ + auVar318._8_4_ * auVar326._8_4_;
    auVar195._12_4_ = fVar302 * auVar242._12_4_ + auVar318._12_4_ * auVar326._12_4_;
    auVar195._16_4_ = fVar303 * auVar242._16_4_ + auVar318._16_4_ * auVar326._16_4_;
    auVar195._20_4_ = fVar304 * auVar242._20_4_ + auVar318._20_4_ * auVar326._20_4_;
    auVar195._24_4_ = fVar305 * auVar242._24_4_ + auVar318._24_4_ * auVar326._24_4_;
    auVar195._28_4_ = fVar340 + fVar202;
    auVar21 = vsubps_avx(auVar111,auVar223);
    auVar109 = vsubps_avx(auVar326,auVar242);
    local_508 = auVar96._0_4_;
    fStack_504 = auVar96._4_4_;
    fStack_500 = auVar96._8_4_;
    fStack_4fc = auVar96._12_4_;
    local_118 = local_508 * auVar21._0_4_ * 3.0;
    fStack_114 = fStack_504 * auVar21._4_4_ * 3.0;
    auVar22._4_4_ = fStack_114;
    auVar22._0_4_ = local_118;
    fStack_110 = fStack_500 * auVar21._8_4_ * 3.0;
    auVar22._8_4_ = fStack_110;
    fStack_10c = fStack_4fc * auVar21._12_4_ * 3.0;
    auVar22._12_4_ = fStack_10c;
    fStack_108 = local_508 * auVar21._16_4_ * 3.0;
    auVar22._16_4_ = fStack_108;
    fStack_104 = fStack_504 * auVar21._20_4_ * 3.0;
    auVar22._20_4_ = fStack_104;
    fStack_100 = fStack_500 * auVar21._24_4_ * 3.0;
    auVar22._24_4_ = fStack_100;
    auVar22._28_4_ = auVar21._28_4_;
    local_138 = local_508 * auVar109._0_4_ * 3.0;
    fStack_134 = fStack_504 * auVar109._4_4_ * 3.0;
    auVar23._4_4_ = fStack_134;
    auVar23._0_4_ = local_138;
    fStack_130 = fStack_500 * auVar109._8_4_ * 3.0;
    auVar23._8_4_ = fStack_130;
    fStack_12c = fStack_4fc * auVar109._12_4_ * 3.0;
    auVar23._12_4_ = fStack_12c;
    fStack_128 = local_508 * auVar109._16_4_ * 3.0;
    auVar23._16_4_ = fStack_128;
    fStack_124 = fStack_504 * auVar109._20_4_ * 3.0;
    auVar23._20_4_ = fStack_124;
    fStack_120 = fStack_500 * auVar109._24_4_ * 3.0;
    auVar23._24_4_ = fStack_120;
    auVar23._28_4_ = fVar340;
    auVar22 = vsubps_avx(local_d8,auVar22);
    auVar109 = vperm2f128_avx(auVar22,auVar22,1);
    auVar109 = vshufps_avx(auVar109,auVar22,0x30);
    auVar109 = vshufps_avx(auVar22,auVar109,0x29);
    auVar23 = vsubps_avx(auVar195,auVar23);
    auVar22 = vperm2f128_avx(auVar23,auVar23,1);
    auVar22 = vshufps_avx(auVar22,auVar23,0x30);
    auVar23 = vshufps_avx(auVar23,auVar22,0x29);
    fVar338 = auVar166._0_4_;
    fVar339 = auVar166._4_4_;
    fVar363 = auVar166._8_4_;
    fVar232 = auVar205._12_4_;
    fVar229 = auVar133._0_4_;
    fVar248 = auVar133._4_4_;
    fVar327 = auVar133._8_4_;
    fVar334 = auVar133._12_4_;
    auVar96 = vshufps_avx(auVar263,auVar263,0xaa);
    fVar198 = auVar96._0_4_;
    fVar203 = auVar96._4_4_;
    fVar227 = auVar96._8_4_;
    fVar244 = auVar96._12_4_;
    fVar231 = auVar318._0_4_ * fVar198 + fVar338 * fVar288;
    fVar117 = auVar318._4_4_ * fVar203 + fVar339 * fVar300;
    fVar118 = auVar318._8_4_ * fVar227 + fVar363 * fVar301;
    fVar119 = auVar318._12_4_ * fVar244 + auVar166._12_4_ * fVar302;
    fVar120 = auVar318._16_4_ * fVar198 + fVar338 * fVar303;
    fVar202 = auVar318._20_4_ * fVar203 + fVar339 * fVar304;
    fVar247 = auVar318._24_4_ * fVar227 + fVar363 * fVar305;
    auVar96 = vshufps_avx(auVar263,auVar263,0xff);
    fVar200 = auVar96._0_4_;
    fVar225 = auVar96._4_4_;
    fVar230 = auVar96._8_4_;
    fVar245 = auVar96._12_4_;
    fVar267 = auVar318._0_4_ * fVar200 + fVar229 * fVar288;
    fVar284 = auVar318._4_4_ * fVar225 + fVar248 * fVar300;
    fVar285 = auVar318._8_4_ * fVar230 + fVar327 * fVar301;
    fVar286 = auVar318._12_4_ * fVar245 + fVar334 * fVar302;
    fVar335 = auVar318._16_4_ * fVar200 + fVar229 * fVar303;
    fVar287 = auVar318._20_4_ * fVar225 + fVar248 * fVar304;
    fVar336 = auVar318._24_4_ * fVar230 + fVar327 * fVar305;
    auVar96 = vshufps_avx(auVar212,auVar212,0xaa);
    fVar337 = auVar96._12_4_ + fVar244;
    auVar180 = vshufps_avx(auVar212,auVar212,0xff);
    fVar246 = auVar180._12_4_;
    auVar112._0_4_ =
         fVar288 * (fVar338 * auVar318._0_4_ + fVar288 * auVar205._0_4_) + auVar318._0_4_ * fVar231;
    auVar112._4_4_ =
         fVar300 * (fVar339 * auVar318._4_4_ + fVar300 * auVar205._4_4_) + auVar318._4_4_ * fVar117;
    auVar112._8_4_ =
         fVar301 * (fVar363 * auVar318._8_4_ + fVar301 * auVar205._8_4_) + auVar318._8_4_ * fVar118;
    auVar112._12_4_ =
         fVar302 * (auVar166._12_4_ * auVar318._12_4_ + fVar302 * fVar232) +
         auVar318._12_4_ * fVar119;
    auVar112._16_4_ =
         fVar303 * (fVar338 * auVar318._16_4_ + fVar303 * auVar205._0_4_) +
         auVar318._16_4_ * fVar120;
    auVar112._20_4_ =
         fVar304 * (fVar339 * auVar318._20_4_ + fVar304 * auVar205._4_4_) +
         auVar318._20_4_ * fVar202;
    auVar112._24_4_ =
         fVar305 * (fVar363 * auVar318._24_4_ + fVar305 * auVar205._8_4_) +
         auVar318._24_4_ * fVar247;
    auVar112._28_4_ = auVar23._28_4_ + fVar232 + fVar246;
    auVar147._0_4_ =
         fVar288 * (fVar229 * auVar318._0_4_ + auVar132._0_4_ * fVar288) + auVar318._0_4_ * fVar267;
    auVar147._4_4_ =
         fVar300 * (fVar248 * auVar318._4_4_ + auVar132._4_4_ * fVar300) + auVar318._4_4_ * fVar284;
    auVar147._8_4_ =
         fVar301 * (fVar327 * auVar318._8_4_ + auVar132._8_4_ * fVar301) + auVar318._8_4_ * fVar285;
    auVar147._12_4_ =
         fVar302 * (fVar334 * auVar318._12_4_ + auVar132._12_4_ * fVar302) +
         auVar318._12_4_ * fVar286;
    auVar147._16_4_ =
         fVar303 * (fVar229 * auVar318._16_4_ + auVar132._0_4_ * fVar303) +
         auVar318._16_4_ * fVar335;
    auVar147._20_4_ =
         fVar304 * (fVar248 * auVar318._20_4_ + auVar132._4_4_ * fVar304) +
         auVar318._20_4_ * fVar287;
    auVar147._24_4_ =
         fVar305 * (fVar327 * auVar318._24_4_ + auVar132._8_4_ * fVar305) +
         auVar318._24_4_ * fVar336;
    auVar147._28_4_ = fVar232 + auVar22._28_4_ + fVar246;
    auVar22 = vperm2f128_avx(local_d8,local_d8,1);
    auVar22 = vshufps_avx(auVar22,local_d8,0x30);
    auVar110 = vshufps_avx(local_d8,auVar22,0x29);
    auVar243._0_4_ =
         auVar318._0_4_ * (auVar96._0_4_ * auVar318._0_4_ + fVar288 * fVar198) + fVar288 * fVar231;
    auVar243._4_4_ =
         auVar318._4_4_ * (auVar96._4_4_ * auVar318._4_4_ + fVar300 * fVar203) + fVar300 * fVar117;
    auVar243._8_4_ =
         auVar318._8_4_ * (auVar96._8_4_ * auVar318._8_4_ + fVar301 * fVar227) + fVar301 * fVar118;
    auVar243._12_4_ =
         auVar318._12_4_ * (auVar96._12_4_ * auVar318._12_4_ + fVar302 * fVar244) +
         fVar302 * fVar119;
    auVar243._16_4_ =
         auVar318._16_4_ * (auVar96._0_4_ * auVar318._16_4_ + fVar303 * fVar198) + fVar303 * fVar120
    ;
    auVar243._20_4_ =
         auVar318._20_4_ * (auVar96._4_4_ * auVar318._20_4_ + fVar304 * fVar203) + fVar304 * fVar202
    ;
    auVar243._24_4_ =
         auVar318._24_4_ * (auVar96._8_4_ * auVar318._24_4_ + fVar305 * fVar227) + fVar305 * fVar247
    ;
    auVar243._28_4_ = fVar337 + fVar346 + auVar242._28_4_;
    auVar283._0_4_ =
         fVar288 * fVar267 + auVar318._0_4_ * (auVar318._0_4_ * auVar180._0_4_ + fVar288 * fVar200);
    auVar283._4_4_ =
         fVar300 * fVar284 + auVar318._4_4_ * (auVar318._4_4_ * auVar180._4_4_ + fVar300 * fVar225);
    auVar283._8_4_ =
         fVar301 * fVar285 + auVar318._8_4_ * (auVar318._8_4_ * auVar180._8_4_ + fVar301 * fVar230);
    auVar283._12_4_ =
         fVar302 * fVar286 + auVar318._12_4_ * (auVar318._12_4_ * fVar246 + fVar302 * fVar245);
    auVar283._16_4_ =
         fVar303 * fVar335 +
         auVar318._16_4_ * (auVar318._16_4_ * auVar180._0_4_ + fVar303 * fVar200);
    auVar283._20_4_ =
         fVar304 * fVar287 +
         auVar318._20_4_ * (auVar318._20_4_ * auVar180._4_4_ + fVar304 * fVar225);
    auVar283._24_4_ =
         fVar305 * fVar336 +
         auVar318._24_4_ * (auVar318._24_4_ * auVar180._8_4_ + fVar305 * fVar230);
    auVar283._28_4_ = fVar346 + fVar334 + fVar246 + fVar245;
    auVar266._0_4_ = fVar288 * auVar112._0_4_ + auVar318._0_4_ * auVar243._0_4_;
    auVar266._4_4_ = fVar300 * auVar112._4_4_ + auVar318._4_4_ * auVar243._4_4_;
    auVar266._8_4_ = fVar301 * auVar112._8_4_ + auVar318._8_4_ * auVar243._8_4_;
    auVar266._12_4_ = fVar302 * auVar112._12_4_ + auVar318._12_4_ * auVar243._12_4_;
    auVar266._16_4_ = fVar303 * auVar112._16_4_ + auVar318._16_4_ * auVar243._16_4_;
    auVar266._20_4_ = fVar304 * auVar112._20_4_ + auVar318._20_4_ * auVar243._20_4_;
    auVar266._24_4_ = fVar305 * auVar112._24_4_ + auVar318._24_4_ * auVar243._24_4_;
    auVar266._28_4_ = fVar337 + fVar246 + fVar245;
    auVar299._0_4_ = fVar288 * auVar147._0_4_ + auVar318._0_4_ * auVar283._0_4_;
    auVar299._4_4_ = fVar300 * auVar147._4_4_ + auVar318._4_4_ * auVar283._4_4_;
    auVar299._8_4_ = fVar301 * auVar147._8_4_ + auVar318._8_4_ * auVar283._8_4_;
    auVar299._12_4_ = fVar302 * auVar147._12_4_ + auVar318._12_4_ * auVar283._12_4_;
    auVar299._16_4_ = fVar303 * auVar147._16_4_ + auVar318._16_4_ * auVar283._16_4_;
    auVar299._20_4_ = fVar304 * auVar147._20_4_ + auVar318._20_4_ * auVar283._20_4_;
    auVar299._24_4_ = fVar305 * auVar147._24_4_ + auVar318._24_4_ * auVar283._24_4_;
    auVar299._28_4_ = auVar20._28_4_ + auVar318._28_4_;
    auVar24 = vsubps_avx(auVar243,auVar112);
    auVar22 = vsubps_avx(auVar283,auVar147);
    local_158 = local_508 * auVar24._0_4_ * 3.0;
    fStack_154 = fStack_504 * auVar24._4_4_ * 3.0;
    auVar20._4_4_ = fStack_154;
    auVar20._0_4_ = local_158;
    fStack_150 = fStack_500 * auVar24._8_4_ * 3.0;
    auVar20._8_4_ = fStack_150;
    fStack_14c = fStack_4fc * auVar24._12_4_ * 3.0;
    auVar20._12_4_ = fStack_14c;
    fStack_148 = local_508 * auVar24._16_4_ * 3.0;
    auVar20._16_4_ = fStack_148;
    fStack_144 = fStack_504 * auVar24._20_4_ * 3.0;
    auVar20._20_4_ = fStack_144;
    fStack_140 = fStack_500 * auVar24._24_4_ * 3.0;
    auVar20._24_4_ = fStack_140;
    auVar20._28_4_ = auVar24._28_4_;
    local_178 = local_508 * auVar22._0_4_ * 3.0;
    fStack_174 = fStack_504 * auVar22._4_4_ * 3.0;
    auVar25._4_4_ = fStack_174;
    auVar25._0_4_ = local_178;
    fStack_170 = fStack_500 * auVar22._8_4_ * 3.0;
    auVar25._8_4_ = fStack_170;
    fStack_16c = fStack_4fc * auVar22._12_4_ * 3.0;
    auVar25._12_4_ = fStack_16c;
    fStack_168 = local_508 * auVar22._16_4_ * 3.0;
    auVar25._16_4_ = fStack_168;
    fStack_164 = fStack_504 * auVar22._20_4_ * 3.0;
    auVar25._20_4_ = fStack_164;
    fStack_160 = fStack_500 * auVar22._24_4_ * 3.0;
    auVar25._24_4_ = fStack_160;
    auVar25._28_4_ = auVar243._28_4_;
    auVar22 = vperm2f128_avx(auVar266,auVar266,1);
    auVar22 = vshufps_avx(auVar22,auVar266,0x30);
    auVar111 = vshufps_avx(auVar266,auVar22,0x29);
    auVar20 = vsubps_avx(auVar266,auVar20);
    auVar22 = vperm2f128_avx(auVar20,auVar20,1);
    auVar22 = vshufps_avx(auVar22,auVar20,0x30);
    auVar22 = vshufps_avx(auVar20,auVar22,0x29);
    auVar25 = vsubps_avx(auVar299,auVar25);
    auVar20 = vperm2f128_avx(auVar25,auVar25,1);
    auVar20 = vshufps_avx(auVar20,auVar25,0x30);
    local_b8 = vshufps_avx(auVar25,auVar20,0x29);
    auVar26 = vsubps_avx(auVar266,local_d8);
    auVar112 = vsubps_avx(auVar111,auVar110);
    fVar198 = auVar112._0_4_ + auVar26._0_4_;
    fVar200 = auVar112._4_4_ + auVar26._4_4_;
    fVar203 = auVar112._8_4_ + auVar26._8_4_;
    fVar225 = auVar112._12_4_ + auVar26._12_4_;
    fVar227 = auVar112._16_4_ + auVar26._16_4_;
    fVar230 = auVar112._20_4_ + auVar26._20_4_;
    fVar232 = auVar112._24_4_ + auVar26._24_4_;
    auVar20 = vperm2f128_avx(auVar195,auVar195,1);
    auVar20 = vshufps_avx(auVar20,auVar195,0x30);
    local_f8 = vshufps_avx(auVar195,auVar20,0x29);
    auVar20 = vperm2f128_avx(auVar299,auVar299,1);
    auVar20 = vshufps_avx(auVar20,auVar299,0x30);
    auVar25 = vshufps_avx(auVar299,auVar20,0x29);
    auVar20 = vsubps_avx(auVar299,auVar195);
    auVar147 = vsubps_avx(auVar25,local_f8);
    fVar244 = auVar147._0_4_ + auVar20._0_4_;
    fVar245 = auVar147._4_4_ + auVar20._4_4_;
    fVar246 = auVar147._8_4_ + auVar20._8_4_;
    fVar231 = auVar147._12_4_ + auVar20._12_4_;
    fVar117 = auVar147._16_4_ + auVar20._16_4_;
    fVar118 = auVar147._20_4_ + auVar20._20_4_;
    fVar119 = auVar147._24_4_ + auVar20._24_4_;
    auVar27._4_4_ = fVar200 * auVar195._4_4_;
    auVar27._0_4_ = fVar198 * auVar195._0_4_;
    auVar27._8_4_ = fVar203 * auVar195._8_4_;
    auVar27._12_4_ = fVar225 * auVar195._12_4_;
    auVar27._16_4_ = fVar227 * auVar195._16_4_;
    auVar27._20_4_ = fVar230 * auVar195._20_4_;
    auVar27._24_4_ = fVar232 * auVar195._24_4_;
    auVar27._28_4_ = auVar20._28_4_;
    auVar28._4_4_ = fVar245 * local_d8._4_4_;
    auVar28._0_4_ = fVar244 * local_d8._0_4_;
    auVar28._8_4_ = fVar246 * local_d8._8_4_;
    auVar28._12_4_ = fVar231 * local_d8._12_4_;
    auVar28._16_4_ = fVar117 * local_d8._16_4_;
    auVar28._20_4_ = fVar118 * local_d8._20_4_;
    auVar28._24_4_ = fVar119 * local_d8._24_4_;
    auVar28._28_4_ = fVar337;
    auVar27 = vsubps_avx(auVar27,auVar28);
    local_118 = local_d8._0_4_ + local_118;
    fStack_114 = local_d8._4_4_ + fStack_114;
    fStack_110 = local_d8._8_4_ + fStack_110;
    fStack_10c = local_d8._12_4_ + fStack_10c;
    fStack_108 = local_d8._16_4_ + fStack_108;
    fStack_104 = local_d8._20_4_ + fStack_104;
    fStack_100 = local_d8._24_4_ + fStack_100;
    fStack_fc = local_d8._28_4_ + auVar21._28_4_;
    local_138 = local_138 + auVar195._0_4_;
    fStack_134 = fStack_134 + auVar195._4_4_;
    fStack_130 = fStack_130 + auVar195._8_4_;
    fStack_12c = fStack_12c + auVar195._12_4_;
    fStack_128 = fStack_128 + auVar195._16_4_;
    fStack_124 = fStack_124 + auVar195._20_4_;
    fStack_120 = fStack_120 + auVar195._24_4_;
    fStack_11c = fVar340 + auVar195._28_4_;
    auVar21._4_4_ = fVar200 * fStack_134;
    auVar21._0_4_ = fVar198 * local_138;
    auVar21._8_4_ = fVar203 * fStack_130;
    auVar21._12_4_ = fVar225 * fStack_12c;
    auVar21._16_4_ = fVar227 * fStack_128;
    auVar21._20_4_ = fVar230 * fStack_124;
    auVar21._24_4_ = fVar232 * fStack_120;
    auVar21._28_4_ = fVar340;
    auVar29._4_4_ = fVar245 * fStack_114;
    auVar29._0_4_ = fVar244 * local_118;
    auVar29._8_4_ = fVar246 * fStack_110;
    auVar29._12_4_ = fVar231 * fStack_10c;
    auVar29._16_4_ = fVar117 * fStack_108;
    auVar29._20_4_ = fVar118 * fStack_104;
    auVar29._24_4_ = fVar119 * fStack_100;
    auVar29._28_4_ = fVar340 + auVar195._28_4_;
    auVar21 = vsubps_avx(auVar21,auVar29);
    local_538 = auVar23._0_4_;
    fStack_534 = auVar23._4_4_;
    fStack_530 = auVar23._8_4_;
    fStack_52c = auVar23._12_4_;
    fStack_528 = auVar23._16_4_;
    fStack_524 = auVar23._20_4_;
    fStack_520 = auVar23._24_4_;
    auVar30._4_4_ = fVar200 * fStack_534;
    auVar30._0_4_ = fVar198 * local_538;
    auVar30._8_4_ = fVar203 * fStack_530;
    auVar30._12_4_ = fVar225 * fStack_52c;
    auVar30._16_4_ = fVar227 * fStack_528;
    auVar30._20_4_ = fVar230 * fStack_524;
    auVar30._24_4_ = fVar232 * fStack_520;
    auVar30._28_4_ = fVar340;
    local_5c8._0_4_ = auVar109._0_4_;
    local_5c8._4_4_ = auVar109._4_4_;
    fStack_5c0 = auVar109._8_4_;
    fStack_5bc = auVar109._12_4_;
    fStack_5b8 = auVar109._16_4_;
    fStack_5b4 = auVar109._20_4_;
    fStack_5b0 = auVar109._24_4_;
    auVar31._4_4_ = fVar245 * (float)local_5c8._4_4_;
    auVar31._0_4_ = fVar244 * (float)local_5c8._0_4_;
    auVar31._8_4_ = fVar246 * fStack_5c0;
    auVar31._12_4_ = fVar231 * fStack_5bc;
    auVar31._16_4_ = fVar117 * fStack_5b8;
    auVar31._20_4_ = fVar118 * fStack_5b4;
    auVar31._24_4_ = fVar119 * fStack_5b0;
    auVar31._28_4_ = local_d8._28_4_;
    auVar28 = vsubps_avx(auVar30,auVar31);
    auVar32._4_4_ = local_f8._4_4_ * fVar200;
    auVar32._0_4_ = local_f8._0_4_ * fVar198;
    auVar32._8_4_ = local_f8._8_4_ * fVar203;
    auVar32._12_4_ = local_f8._12_4_ * fVar225;
    auVar32._16_4_ = local_f8._16_4_ * fVar227;
    auVar32._20_4_ = local_f8._20_4_ * fVar230;
    auVar32._24_4_ = local_f8._24_4_ * fVar232;
    auVar32._28_4_ = fVar340;
    auVar33._4_4_ = auVar110._4_4_ * fVar245;
    auVar33._0_4_ = auVar110._0_4_ * fVar244;
    auVar33._8_4_ = auVar110._8_4_ * fVar246;
    auVar33._12_4_ = auVar110._12_4_ * fVar231;
    auVar33._16_4_ = auVar110._16_4_ * fVar117;
    auVar33._20_4_ = auVar110._20_4_ * fVar118;
    auVar33._24_4_ = auVar110._24_4_ * fVar119;
    auVar33._28_4_ = local_f8._28_4_;
    local_508 = auVar22._0_4_;
    fStack_504 = auVar22._4_4_;
    fStack_500 = auVar22._8_4_;
    fStack_4fc = auVar22._12_4_;
    fStack_4f8 = auVar22._16_4_;
    fStack_4f4 = auVar22._20_4_;
    fStack_4f0 = auVar22._24_4_;
    auVar29 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = auVar299._4_4_ * fVar200;
    auVar34._0_4_ = auVar299._0_4_ * fVar198;
    auVar34._8_4_ = auVar299._8_4_ * fVar203;
    auVar34._12_4_ = auVar299._12_4_ * fVar225;
    auVar34._16_4_ = auVar299._16_4_ * fVar227;
    auVar34._20_4_ = auVar299._20_4_ * fVar230;
    auVar34._24_4_ = auVar299._24_4_ * fVar232;
    auVar34._28_4_ = fVar340;
    auVar35._4_4_ = fVar245 * auVar266._4_4_;
    auVar35._0_4_ = fVar244 * auVar266._0_4_;
    auVar35._8_4_ = fVar246 * auVar266._8_4_;
    auVar35._12_4_ = fVar231 * auVar266._12_4_;
    auVar35._16_4_ = fVar117 * auVar266._16_4_;
    auVar35._20_4_ = fVar118 * auVar266._20_4_;
    auVar35._24_4_ = fVar119 * auVar266._24_4_;
    auVar35._28_4_ = fStack_fc;
    auVar30 = vsubps_avx(auVar34,auVar35);
    local_158 = auVar266._0_4_ + local_158;
    fStack_154 = auVar266._4_4_ + fStack_154;
    fStack_150 = auVar266._8_4_ + fStack_150;
    fStack_14c = auVar266._12_4_ + fStack_14c;
    fStack_148 = auVar266._16_4_ + fStack_148;
    fStack_144 = auVar266._20_4_ + fStack_144;
    fStack_140 = auVar266._24_4_ + fStack_140;
    fStack_13c = auVar266._28_4_ + auVar24._28_4_;
    local_178 = auVar299._0_4_ + local_178;
    fStack_174 = auVar299._4_4_ + fStack_174;
    fStack_170 = auVar299._8_4_ + fStack_170;
    fStack_16c = auVar299._12_4_ + fStack_16c;
    fStack_168 = auVar299._16_4_ + fStack_168;
    fStack_164 = auVar299._20_4_ + fStack_164;
    fStack_160 = auVar299._24_4_ + fStack_160;
    fStack_15c = auVar299._28_4_ + auVar243._28_4_;
    auVar24._4_4_ = fVar200 * fStack_174;
    auVar24._0_4_ = fVar198 * local_178;
    auVar24._8_4_ = fVar203 * fStack_170;
    auVar24._12_4_ = fVar225 * fStack_16c;
    auVar24._16_4_ = fVar227 * fStack_168;
    auVar24._20_4_ = fVar230 * fStack_164;
    auVar24._24_4_ = fVar232 * fStack_160;
    auVar24._28_4_ = auVar299._28_4_ + auVar243._28_4_;
    auVar36._4_4_ = fStack_154 * fVar245;
    auVar36._0_4_ = local_158 * fVar244;
    auVar36._8_4_ = fStack_150 * fVar246;
    auVar36._12_4_ = fStack_14c * fVar231;
    auVar36._16_4_ = fStack_148 * fVar117;
    auVar36._20_4_ = fStack_144 * fVar118;
    auVar36._24_4_ = fStack_140 * fVar119;
    auVar36._28_4_ = fStack_13c;
    auVar24 = vsubps_avx(auVar24,auVar36);
    auVar37._4_4_ = fVar200 * local_b8._4_4_;
    auVar37._0_4_ = fVar198 * local_b8._0_4_;
    auVar37._8_4_ = fVar203 * local_b8._8_4_;
    auVar37._12_4_ = fVar225 * local_b8._12_4_;
    auVar37._16_4_ = fVar227 * local_b8._16_4_;
    auVar37._20_4_ = fVar230 * local_b8._20_4_;
    auVar37._24_4_ = fVar232 * local_b8._24_4_;
    auVar37._28_4_ = fStack_13c;
    auVar38._4_4_ = fVar245 * fStack_504;
    auVar38._0_4_ = fVar244 * local_508;
    auVar38._8_4_ = fVar246 * fStack_500;
    auVar38._12_4_ = fVar231 * fStack_4fc;
    auVar38._16_4_ = fVar117 * fStack_4f8;
    auVar38._20_4_ = fVar118 * fStack_4f4;
    auVar38._24_4_ = fVar119 * fStack_4f0;
    auVar38._28_4_ = local_b8._28_4_;
    auVar31 = vsubps_avx(auVar37,auVar38);
    auVar39._4_4_ = fVar200 * auVar25._4_4_;
    auVar39._0_4_ = fVar198 * auVar25._0_4_;
    auVar39._8_4_ = fVar203 * auVar25._8_4_;
    auVar39._12_4_ = fVar225 * auVar25._12_4_;
    auVar39._16_4_ = fVar227 * auVar25._16_4_;
    auVar39._20_4_ = fVar230 * auVar25._20_4_;
    auVar39._24_4_ = fVar232 * auVar25._24_4_;
    auVar39._28_4_ = auVar112._28_4_ + auVar26._28_4_;
    auVar26._4_4_ = auVar111._4_4_ * fVar245;
    auVar26._0_4_ = auVar111._0_4_ * fVar244;
    auVar26._8_4_ = auVar111._8_4_ * fVar246;
    auVar26._12_4_ = auVar111._12_4_ * fVar231;
    auVar26._16_4_ = auVar111._16_4_ * fVar117;
    auVar26._20_4_ = auVar111._20_4_ * fVar118;
    auVar26._24_4_ = auVar111._24_4_ * fVar119;
    auVar26._28_4_ = auVar147._28_4_ + auVar20._28_4_;
    auVar26 = vsubps_avx(auVar39,auVar26);
    auVar22 = vminps_avx(auVar27,auVar21);
    auVar109 = vmaxps_avx(auVar27,auVar21);
    auVar23 = vminps_avx(auVar28,auVar29);
    auVar23 = vminps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(auVar28,auVar29);
    auVar109 = vmaxps_avx(auVar109,auVar22);
    auVar20 = vminps_avx(auVar30,auVar24);
    auVar22 = vmaxps_avx(auVar30,auVar24);
    auVar21 = vminps_avx(auVar31,auVar26);
    auVar21 = vminps_avx(auVar20,auVar21);
    auVar21 = vminps_avx(auVar23,auVar21);
    auVar23 = vmaxps_avx(auVar31,auVar26);
    auVar22 = vmaxps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(auVar109,auVar22);
    auVar109 = vcmpps_avx(auVar21,local_78,2);
    auVar22 = vcmpps_avx(auVar22,local_98,5);
    auVar109 = vandps_avx(auVar22,auVar109);
    auVar22 = local_198 & auVar109;
    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0x7f,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar22 >> 0xbf,0) != '\0') ||
        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar22[0x1f] < '\0')
    {
      auVar22 = vsubps_avx(auVar110,local_d8);
      auVar23 = vsubps_avx(auVar111,auVar266);
      fVar200 = auVar22._0_4_ + auVar23._0_4_;
      fVar203 = auVar22._4_4_ + auVar23._4_4_;
      fVar225 = auVar22._8_4_ + auVar23._8_4_;
      fVar227 = auVar22._12_4_ + auVar23._12_4_;
      fVar230 = auVar22._16_4_ + auVar23._16_4_;
      fVar232 = auVar22._20_4_ + auVar23._20_4_;
      fVar244 = auVar22._24_4_ + auVar23._24_4_;
      auVar21 = vsubps_avx(local_f8,auVar195);
      auVar24 = vsubps_avx(auVar25,auVar299);
      fVar245 = auVar21._0_4_ + auVar24._0_4_;
      fVar246 = auVar21._4_4_ + auVar24._4_4_;
      fVar231 = auVar21._8_4_ + auVar24._8_4_;
      fVar117 = auVar21._12_4_ + auVar24._12_4_;
      fVar118 = auVar21._16_4_ + auVar24._16_4_;
      fVar119 = auVar21._20_4_ + auVar24._20_4_;
      fVar120 = auVar21._24_4_ + auVar24._24_4_;
      fVar198 = auVar24._28_4_;
      auVar40._4_4_ = auVar195._4_4_ * fVar203;
      auVar40._0_4_ = auVar195._0_4_ * fVar200;
      auVar40._8_4_ = auVar195._8_4_ * fVar225;
      auVar40._12_4_ = auVar195._12_4_ * fVar227;
      auVar40._16_4_ = auVar195._16_4_ * fVar230;
      auVar40._20_4_ = auVar195._20_4_ * fVar232;
      auVar40._24_4_ = auVar195._24_4_ * fVar244;
      auVar40._28_4_ = auVar195._28_4_;
      auVar41._4_4_ = local_d8._4_4_ * fVar246;
      auVar41._0_4_ = local_d8._0_4_ * fVar245;
      auVar41._8_4_ = local_d8._8_4_ * fVar231;
      auVar41._12_4_ = local_d8._12_4_ * fVar117;
      auVar41._16_4_ = local_d8._16_4_ * fVar118;
      auVar41._20_4_ = local_d8._20_4_ * fVar119;
      auVar41._24_4_ = local_d8._24_4_ * fVar120;
      auVar41._28_4_ = local_d8._28_4_;
      auVar24 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = fVar203 * fStack_134;
      auVar42._0_4_ = fVar200 * local_138;
      auVar42._8_4_ = fVar225 * fStack_130;
      auVar42._12_4_ = fVar227 * fStack_12c;
      auVar42._16_4_ = fVar230 * fStack_128;
      auVar42._20_4_ = fVar232 * fStack_124;
      auVar42._24_4_ = fVar244 * fStack_120;
      auVar42._28_4_ = auVar195._28_4_;
      auVar43._4_4_ = fVar246 * fStack_114;
      auVar43._0_4_ = fVar245 * local_118;
      auVar43._8_4_ = fVar231 * fStack_110;
      auVar43._12_4_ = fVar117 * fStack_10c;
      auVar43._16_4_ = fVar118 * fStack_108;
      auVar43._20_4_ = fVar119 * fStack_104;
      auVar43._24_4_ = fVar120 * fStack_100;
      auVar43._28_4_ = fVar198;
      auVar26 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = fVar203 * fStack_534;
      auVar44._0_4_ = fVar200 * local_538;
      auVar44._8_4_ = fVar225 * fStack_530;
      auVar44._12_4_ = fVar227 * fStack_52c;
      auVar44._16_4_ = fVar230 * fStack_528;
      auVar44._20_4_ = fVar232 * fStack_524;
      auVar44._24_4_ = fVar244 * fStack_520;
      auVar44._28_4_ = fVar198;
      auVar45._4_4_ = fVar246 * (float)local_5c8._4_4_;
      auVar45._0_4_ = fVar245 * (float)local_5c8._0_4_;
      auVar45._8_4_ = fVar231 * fStack_5c0;
      auVar45._12_4_ = fVar117 * fStack_5bc;
      auVar45._16_4_ = fVar118 * fStack_5b8;
      auVar45._20_4_ = fVar119 * fStack_5b4;
      auVar45._24_4_ = fVar120 * fStack_5b0;
      auVar45._28_4_ = auVar20._28_4_;
      auVar112 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = local_f8._4_4_ * fVar203;
      auVar46._0_4_ = local_f8._0_4_ * fVar200;
      auVar46._8_4_ = local_f8._8_4_ * fVar225;
      auVar46._12_4_ = local_f8._12_4_ * fVar227;
      auVar46._16_4_ = local_f8._16_4_ * fVar230;
      auVar46._20_4_ = local_f8._20_4_ * fVar232;
      auVar46._24_4_ = local_f8._24_4_ * fVar244;
      auVar46._28_4_ = auVar20._28_4_;
      auVar47._4_4_ = auVar110._4_4_ * fVar246;
      auVar47._0_4_ = auVar110._0_4_ * fVar245;
      auVar47._8_4_ = auVar110._8_4_ * fVar231;
      auVar47._12_4_ = auVar110._12_4_ * fVar117;
      auVar47._16_4_ = auVar110._16_4_ * fVar118;
      auVar47._20_4_ = auVar110._20_4_ * fVar119;
      uVar4 = auVar110._28_4_;
      auVar47._24_4_ = auVar110._24_4_ * fVar120;
      auVar47._28_4_ = uVar4;
      auVar110 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = auVar299._4_4_ * fVar203;
      auVar48._0_4_ = auVar299._0_4_ * fVar200;
      auVar48._8_4_ = auVar299._8_4_ * fVar225;
      auVar48._12_4_ = auVar299._12_4_ * fVar227;
      auVar48._16_4_ = auVar299._16_4_ * fVar230;
      auVar48._20_4_ = auVar299._20_4_ * fVar232;
      auVar48._24_4_ = auVar299._24_4_ * fVar244;
      auVar48._28_4_ = uVar4;
      auVar49._4_4_ = auVar266._4_4_ * fVar246;
      auVar49._0_4_ = auVar266._0_4_ * fVar245;
      auVar49._8_4_ = auVar266._8_4_ * fVar231;
      auVar49._12_4_ = auVar266._12_4_ * fVar117;
      auVar49._16_4_ = auVar266._16_4_ * fVar118;
      auVar49._20_4_ = auVar266._20_4_ * fVar119;
      auVar49._24_4_ = auVar266._24_4_ * fVar120;
      auVar49._28_4_ = auVar266._28_4_;
      auVar147 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = fVar203 * fStack_174;
      auVar50._0_4_ = fVar200 * local_178;
      auVar50._8_4_ = fVar225 * fStack_170;
      auVar50._12_4_ = fVar227 * fStack_16c;
      auVar50._16_4_ = fVar230 * fStack_168;
      auVar50._20_4_ = fVar232 * fStack_164;
      auVar50._24_4_ = fVar244 * fStack_160;
      auVar50._28_4_ = uVar4;
      auVar51._4_4_ = fVar246 * fStack_154;
      auVar51._0_4_ = fVar245 * local_158;
      auVar51._8_4_ = fVar231 * fStack_150;
      auVar51._12_4_ = fVar117 * fStack_14c;
      auVar51._16_4_ = fVar118 * fStack_148;
      auVar51._20_4_ = fVar119 * fStack_144;
      auVar51._24_4_ = fVar120 * fStack_140;
      auVar51._28_4_ = auVar299._28_4_;
      auVar27 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = fVar203 * local_b8._4_4_;
      auVar52._0_4_ = fVar200 * local_b8._0_4_;
      auVar52._8_4_ = fVar225 * local_b8._8_4_;
      auVar52._12_4_ = fVar227 * local_b8._12_4_;
      auVar52._16_4_ = fVar230 * local_b8._16_4_;
      auVar52._20_4_ = fVar232 * local_b8._20_4_;
      auVar52._24_4_ = fVar244 * local_b8._24_4_;
      auVar52._28_4_ = auVar299._28_4_;
      auVar53._4_4_ = fStack_504 * fVar246;
      auVar53._0_4_ = local_508 * fVar245;
      auVar53._8_4_ = fStack_500 * fVar231;
      auVar53._12_4_ = fStack_4fc * fVar117;
      auVar53._16_4_ = fStack_4f8 * fVar118;
      auVar53._20_4_ = fStack_4f4 * fVar119;
      auVar53._24_4_ = fStack_4f0 * fVar120;
      auVar53._28_4_ = local_f8._28_4_;
      auVar28 = vsubps_avx(auVar52,auVar53);
      auVar54._4_4_ = fVar203 * auVar25._4_4_;
      auVar54._0_4_ = fVar200 * auVar25._0_4_;
      auVar54._8_4_ = fVar225 * auVar25._8_4_;
      auVar54._12_4_ = fVar227 * auVar25._12_4_;
      auVar54._16_4_ = fVar230 * auVar25._16_4_;
      auVar54._20_4_ = fVar232 * auVar25._20_4_;
      auVar54._24_4_ = fVar244 * auVar25._24_4_;
      auVar54._28_4_ = auVar22._28_4_ + auVar23._28_4_;
      auVar55._4_4_ = auVar111._4_4_ * fVar246;
      auVar55._0_4_ = auVar111._0_4_ * fVar245;
      auVar55._8_4_ = auVar111._8_4_ * fVar231;
      auVar55._12_4_ = auVar111._12_4_ * fVar117;
      auVar55._16_4_ = auVar111._16_4_ * fVar118;
      auVar55._20_4_ = auVar111._20_4_ * fVar119;
      auVar55._24_4_ = auVar111._24_4_ * fVar120;
      auVar55._28_4_ = auVar21._28_4_ + fVar198;
      auVar111 = vsubps_avx(auVar54,auVar55);
      auVar23 = vminps_avx(auVar24,auVar26);
      auVar22 = vmaxps_avx(auVar24,auVar26);
      auVar20 = vminps_avx(auVar112,auVar110);
      auVar20 = vminps_avx(auVar23,auVar20);
      auVar23 = vmaxps_avx(auVar112,auVar110);
      auVar22 = vmaxps_avx(auVar22,auVar23);
      auVar21 = vminps_avx(auVar147,auVar27);
      auVar23 = vmaxps_avx(auVar147,auVar27);
      auVar110 = vminps_avx(auVar28,auVar111);
      auVar21 = vminps_avx(auVar21,auVar110);
      auVar21 = vminps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar28,auVar111);
      auVar23 = vmaxps_avx(auVar23,auVar20);
      auVar23 = vmaxps_avx(auVar22,auVar23);
      auVar22 = vcmpps_avx(auVar21,local_78,2);
      auVar23 = vcmpps_avx(auVar23,local_98,5);
      auVar22 = vandps_avx(auVar23,auVar22);
      auVar109 = vandps_avx(local_198,auVar109);
      auVar23 = auVar109 & auVar22;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar23 >> 0x7f,0) != '\0') ||
            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0xbf,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar23[0x1f] < '\0') {
        auVar109 = vandps_avx(auVar22,auVar109);
        uVar66 = vmovmskps_avx(auVar109);
        if (uVar66 != 0) {
          mask_stack[uVar68] = uVar66 & 0xff;
          BVar5 = (BBox1f)vmovlps_avx(auVar290);
          cu_stack[uVar68] = BVar5;
          BVar5 = (BBox1f)vmovlps_avx(auVar269);
          cv_stack[uVar68] = BVar5;
          uVar68 = (ulong)((int)uVar68 + 1);
        }
      }
    }
LAB_0094941e:
    do {
      do {
        do {
          do {
            if ((int)uVar68 == 0) {
              uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar108._4_4_ = uVar4;
              auVar108._0_4_ = uVar4;
              auVar108._8_4_ = uVar4;
              auVar108._12_4_ = uVar4;
              auVar160 = vcmpps_avx(auVar233,auVar108,2);
              uVar67 = vmovmskps_avx(auVar160);
              uVar73 = uVar73 & uVar73 + 0xf & uVar67;
              auVar57 = ZEXT812(0) << 0x20;
              goto LAB_00948132;
            }
            uVar69 = (int)uVar68 - 1;
            uVar66 = mask_stack[uVar69];
            fVar198 = cu_stack[uVar69].lower;
            fVar200 = cu_stack[uVar69].upper;
            auVar352._8_8_ = 0;
            auVar352._0_4_ = cv_stack[uVar69].lower;
            auVar352._4_4_ = cv_stack[uVar69].upper;
            auVar356 = ZEXT1664(auVar352);
            uVar14 = 0;
            if (uVar66 != 0) {
              for (; (uVar66 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
              }
            }
            uVar66 = uVar66 - 1 & uVar66;
            mask_stack[uVar69] = uVar66;
            if (uVar66 == 0) {
              uVar68 = (ulong)uVar69;
            }
            fVar225 = (float)(uVar14 + 1) * 0.14285715;
            fVar203 = (1.0 - (float)uVar14 * 0.14285715) * fVar198 +
                      fVar200 * (float)uVar14 * 0.14285715;
            fVar198 = (1.0 - fVar225) * fVar198 + fVar200 * fVar225;
            fVar200 = fVar198 - fVar203;
            if (0.16666667 <= fVar200) {
              auVar96 = vinsertps_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar198),0x10);
              auVar362 = ZEXT1664(auVar96);
              goto LAB_00948dc4;
            }
            auVar96 = vshufps_avx(auVar352,auVar352,0x50);
            auVar130._8_4_ = 0x3f800000;
            auVar130._0_8_ = 0x3f8000003f800000;
            auVar130._12_4_ = 0x3f800000;
            auVar205 = vsubps_avx(auVar130,auVar96);
            fVar225 = auVar96._0_4_;
            fVar227 = auVar96._4_4_;
            fVar230 = auVar96._8_4_;
            fVar232 = auVar96._12_4_;
            fVar244 = auVar205._0_4_;
            fVar245 = auVar205._4_4_;
            fVar246 = auVar205._8_4_;
            fVar231 = auVar205._12_4_;
            auVar164._0_4_ = auVar279._0_4_ * fVar225 + fVar244 * (float)local_608._0_4_;
            auVar164._4_4_ = auVar279._4_4_ * fVar227 + fVar245 * (float)local_608._4_4_;
            auVar164._8_4_ = auVar279._0_4_ * fVar230 + fVar246 * (float)local_608._0_4_;
            auVar164._12_4_ = auVar279._4_4_ * fVar232 + fVar231 * (float)local_608._4_4_;
            auVar213._0_4_ = auVar294._0_4_ * fVar225 + auVar344._0_4_ * fVar244;
            auVar213._4_4_ = auVar294._4_4_ * fVar227 + auVar344._4_4_ * fVar245;
            auVar213._8_4_ = auVar294._0_4_ * fVar230 + auVar344._0_4_ * fVar246;
            auVar213._12_4_ = auVar294._4_4_ * fVar232 + auVar344._4_4_ * fVar231;
            auVar236._0_4_ = auVar314._0_4_ * fVar225 + auVar211._0_4_ * fVar244;
            auVar236._4_4_ = auVar314._4_4_ * fVar227 + auVar211._4_4_ * fVar245;
            auVar236._8_4_ = auVar314._0_4_ * fVar230 + auVar211._0_4_ * fVar246;
            auVar236._12_4_ = auVar314._4_4_ * fVar232 + auVar211._4_4_ * fVar231;
            auVar93._0_4_ = auVar91._0_4_ * fVar225 + auVar350._0_4_ * fVar244;
            auVar93._4_4_ = auVar91._4_4_ * fVar227 + auVar350._4_4_ * fVar245;
            auVar93._8_4_ = auVar91._0_4_ * fVar230 + auVar350._0_4_ * fVar246;
            auVar93._12_4_ = auVar91._4_4_ * fVar232 + auVar350._4_4_ * fVar231;
            auVar148._16_16_ = auVar164;
            auVar148._0_16_ = auVar164;
            auVar181._16_16_ = auVar213;
            auVar181._0_16_ = auVar213;
            auVar224._16_16_ = auVar236;
            auVar224._0_16_ = auVar236;
            auVar109 = ZEXT2032(CONCAT416(fVar198,ZEXT416((uint)fVar203)));
            auVar109 = vshufps_avx(auVar109,auVar109,0);
            auVar22 = vsubps_avx(auVar181,auVar148);
            fVar225 = auVar109._0_4_;
            fVar227 = auVar109._4_4_;
            fVar230 = auVar109._8_4_;
            fVar232 = auVar109._12_4_;
            fVar244 = auVar109._16_4_;
            fVar245 = auVar109._20_4_;
            fVar246 = auVar109._24_4_;
            auVar149._0_4_ = auVar164._0_4_ + auVar22._0_4_ * fVar225;
            auVar149._4_4_ = auVar164._4_4_ + auVar22._4_4_ * fVar227;
            auVar149._8_4_ = auVar164._8_4_ + auVar22._8_4_ * fVar230;
            auVar149._12_4_ = auVar164._12_4_ + auVar22._12_4_ * fVar232;
            auVar149._16_4_ = auVar164._0_4_ + auVar22._16_4_ * fVar244;
            auVar149._20_4_ = auVar164._4_4_ + auVar22._20_4_ * fVar245;
            auVar149._24_4_ = auVar164._8_4_ + auVar22._24_4_ * fVar246;
            auVar149._28_4_ = auVar164._12_4_ + auVar22._28_4_;
            auVar109 = vsubps_avx(auVar224,auVar181);
            auVar182._0_4_ = auVar213._0_4_ + auVar109._0_4_ * fVar225;
            auVar182._4_4_ = auVar213._4_4_ + auVar109._4_4_ * fVar227;
            auVar182._8_4_ = auVar213._8_4_ + auVar109._8_4_ * fVar230;
            auVar182._12_4_ = auVar213._12_4_ + auVar109._12_4_ * fVar232;
            auVar182._16_4_ = auVar213._0_4_ + auVar109._16_4_ * fVar244;
            auVar182._20_4_ = auVar213._4_4_ + auVar109._20_4_ * fVar245;
            auVar182._24_4_ = auVar213._8_4_ + auVar109._24_4_ * fVar246;
            auVar182._28_4_ = auVar213._12_4_ + auVar109._28_4_;
            auVar96 = vsubps_avx(auVar93,auVar236);
            auVar113._0_4_ = auVar236._0_4_ + auVar96._0_4_ * fVar225;
            auVar113._4_4_ = auVar236._4_4_ + auVar96._4_4_ * fVar227;
            auVar113._8_4_ = auVar236._8_4_ + auVar96._8_4_ * fVar230;
            auVar113._12_4_ = auVar236._12_4_ + auVar96._12_4_ * fVar232;
            auVar113._16_4_ = auVar236._0_4_ + auVar96._0_4_ * fVar244;
            auVar113._20_4_ = auVar236._4_4_ + auVar96._4_4_ * fVar245;
            auVar113._24_4_ = auVar236._8_4_ + auVar96._8_4_ * fVar246;
            auVar113._28_4_ = auVar236._12_4_ + auVar96._12_4_;
            auVar109 = vsubps_avx(auVar182,auVar149);
            auVar150._0_4_ = auVar149._0_4_ + fVar225 * auVar109._0_4_;
            auVar150._4_4_ = auVar149._4_4_ + fVar227 * auVar109._4_4_;
            auVar150._8_4_ = auVar149._8_4_ + fVar230 * auVar109._8_4_;
            auVar150._12_4_ = auVar149._12_4_ + fVar232 * auVar109._12_4_;
            auVar150._16_4_ = auVar149._16_4_ + fVar244 * auVar109._16_4_;
            auVar150._20_4_ = auVar149._20_4_ + fVar245 * auVar109._20_4_;
            auVar150._24_4_ = auVar149._24_4_ + fVar246 * auVar109._24_4_;
            auVar150._28_4_ = auVar149._28_4_ + auVar109._28_4_;
            auVar109 = vsubps_avx(auVar113,auVar182);
            auVar114._0_4_ = auVar182._0_4_ + fVar225 * auVar109._0_4_;
            auVar114._4_4_ = auVar182._4_4_ + fVar227 * auVar109._4_4_;
            auVar114._8_4_ = auVar182._8_4_ + fVar230 * auVar109._8_4_;
            auVar114._12_4_ = auVar182._12_4_ + fVar232 * auVar109._12_4_;
            auVar114._16_4_ = auVar182._16_4_ + fVar244 * auVar109._16_4_;
            auVar114._20_4_ = auVar182._20_4_ + fVar245 * auVar109._20_4_;
            auVar114._24_4_ = auVar182._24_4_ + fVar246 * auVar109._24_4_;
            auVar114._28_4_ = auVar182._28_4_ + auVar109._28_4_;
            auVar109 = vsubps_avx(auVar114,auVar150);
            auVar253._0_4_ = auVar150._0_4_ + fVar225 * auVar109._0_4_;
            auVar253._4_4_ = auVar150._4_4_ + fVar227 * auVar109._4_4_;
            auVar253._8_4_ = auVar150._8_4_ + fVar230 * auVar109._8_4_;
            auVar253._12_4_ = auVar150._12_4_ + fVar232 * auVar109._12_4_;
            auVar258._16_4_ = auVar150._16_4_ + fVar244 * auVar109._16_4_;
            auVar258._0_16_ = auVar253;
            auVar258._20_4_ = auVar150._20_4_ + fVar245 * auVar109._20_4_;
            auVar258._24_4_ = auVar150._24_4_ + fVar246 * auVar109._24_4_;
            auVar258._28_4_ = auVar150._28_4_ + auVar182._28_4_;
            auVar259 = auVar258._16_16_;
            auVar132 = vshufps_avx(ZEXT416((uint)(fVar200 * 0.33333334)),
                                   ZEXT416((uint)(fVar200 * 0.33333334)),0);
            auVar214._0_4_ = auVar253._0_4_ + auVar132._0_4_ * auVar109._0_4_ * 3.0;
            auVar214._4_4_ = auVar253._4_4_ + auVar132._4_4_ * auVar109._4_4_ * 3.0;
            auVar214._8_4_ = auVar253._8_4_ + auVar132._8_4_ * auVar109._8_4_ * 3.0;
            auVar214._12_4_ = auVar253._12_4_ + auVar132._12_4_ * auVar109._12_4_ * 3.0;
            auVar180 = vshufpd_avx(auVar253,auVar253,3);
            auVar144 = vshufpd_avx(auVar259,auVar259,3);
            auVar96 = vsubps_avx(auVar180,auVar253);
            auVar205 = vsubps_avx(auVar144,auVar259);
            auVar94._0_4_ = auVar96._0_4_ + auVar205._0_4_;
            auVar94._4_4_ = auVar96._4_4_ + auVar205._4_4_;
            auVar94._8_4_ = auVar96._8_4_ + auVar205._8_4_;
            auVar94._12_4_ = auVar96._12_4_ + auVar205._12_4_;
            auVar96 = vmovshdup_avx(auVar253);
            auVar205 = vmovshdup_avx(auVar214);
            auVar166 = vshufps_avx(auVar94,auVar94,0);
            auVar133 = vshufps_avx(auVar94,auVar94,0x55);
            fVar225 = auVar133._0_4_;
            fVar227 = auVar133._4_4_;
            fVar230 = auVar133._8_4_;
            fVar232 = auVar133._12_4_;
            fVar244 = auVar166._0_4_;
            fVar245 = auVar166._4_4_;
            fVar246 = auVar166._8_4_;
            fVar231 = auVar166._12_4_;
            auVar95._0_4_ = fVar244 * auVar253._0_4_ + auVar96._0_4_ * fVar225;
            auVar95._4_4_ = fVar245 * auVar253._4_4_ + auVar96._4_4_ * fVar227;
            auVar95._8_4_ = fVar246 * auVar253._8_4_ + auVar96._8_4_ * fVar230;
            auVar95._12_4_ = fVar231 * auVar253._12_4_ + auVar96._12_4_ * fVar232;
            auVar322._0_4_ = fVar244 * auVar214._0_4_ + auVar205._0_4_ * fVar225;
            auVar322._4_4_ = fVar245 * auVar214._4_4_ + auVar205._4_4_ * fVar227;
            auVar322._8_4_ = fVar246 * auVar214._8_4_ + auVar205._8_4_ * fVar230;
            auVar322._12_4_ = fVar231 * auVar214._12_4_ + auVar205._12_4_ * fVar232;
            auVar205 = vshufps_avx(auVar95,auVar95,0xe8);
            auVar166 = vshufps_avx(auVar322,auVar322,0xe8);
            auVar96 = vcmpps_avx(auVar205,auVar166,1);
            uVar66 = vextractps_avx(auVar96,0);
            auVar133 = auVar322;
            if ((uVar66 & 1) == 0) {
              auVar133 = auVar95;
            }
            auVar131._0_4_ = auVar132._0_4_ * auVar109._16_4_ * 3.0;
            auVar131._4_4_ = auVar132._4_4_ * auVar109._20_4_ * 3.0;
            auVar131._8_4_ = auVar132._8_4_ * auVar109._24_4_ * 3.0;
            auVar131._12_4_ = auVar132._12_4_ * 0.0;
            auVar268 = vsubps_avx(auVar259,auVar131);
            auVar132 = vmovshdup_avx(auVar268);
            auVar259 = vmovshdup_avx(auVar259);
            fVar117 = auVar268._0_4_;
            fVar118 = auVar268._4_4_;
            auVar237._0_4_ = fVar117 * fVar244 + auVar132._0_4_ * fVar225;
            auVar237._4_4_ = fVar118 * fVar245 + auVar132._4_4_ * fVar227;
            auVar237._8_4_ = auVar268._8_4_ * fVar246 + auVar132._8_4_ * fVar230;
            auVar237._12_4_ = auVar268._12_4_ * fVar231 + auVar132._12_4_ * fVar232;
            auVar361._0_4_ = fVar244 * auVar258._16_4_ + auVar259._0_4_ * fVar225;
            auVar361._4_4_ = fVar245 * auVar258._20_4_ + auVar259._4_4_ * fVar227;
            auVar361._8_4_ = fVar246 * auVar258._24_4_ + auVar259._8_4_ * fVar230;
            auVar361._12_4_ = fVar231 * auVar258._28_4_ + auVar259._12_4_ * fVar232;
            auVar259 = vshufps_avx(auVar237,auVar237,0xe8);
            auVar260 = vshufps_avx(auVar361,auVar361,0xe8);
            auVar132 = vcmpps_avx(auVar259,auVar260,1);
            uVar66 = vextractps_avx(auVar132,0);
            auVar269 = auVar361;
            if ((uVar66 & 1) == 0) {
              auVar269 = auVar237;
            }
            auVar133 = vmaxss_avx(auVar269,auVar133);
            auVar205 = vminps_avx(auVar205,auVar166);
            auVar166 = vminps_avx(auVar259,auVar260);
            auVar166 = vminps_avx(auVar205,auVar166);
            auVar96 = vshufps_avx(auVar96,auVar96,0x55);
            auVar96 = vblendps_avx(auVar96,auVar132,2);
            auVar132 = vpslld_avx(auVar96,0x1f);
            auVar96 = vshufpd_avx(auVar322,auVar322,1);
            auVar96 = vinsertps_avx(auVar96,auVar361,0x9c);
            auVar205 = vshufpd_avx(auVar95,auVar95,1);
            auVar205 = vinsertps_avx(auVar205,auVar237,0x9c);
            auVar96 = vblendvps_avx(auVar205,auVar96,auVar132);
            auVar205 = vmovshdup_avx(auVar96);
            auVar96 = vmaxss_avx(auVar205,auVar96);
            fVar230 = auVar166._0_4_;
            auVar205 = vmovshdup_avx(auVar166);
            fVar227 = auVar96._0_4_;
            fVar232 = auVar205._0_4_;
            fVar225 = auVar133._0_4_;
            if ((fVar230 < 0.0001) && (-0.0001 < fVar227)) break;
            if ((fVar232 < 0.0001 && -0.0001 < fVar225) || (fVar230 < 0.0001 && -0.0001 < fVar225))
            break;
            auVar132 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar96,1);
            auVar205 = vcmpps_avx(auVar205,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar205 = vandps_avx(auVar205,auVar132);
          } while ((auVar205 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar132 = vcmpps_avx(auVar166,_DAT_01f45a50,1);
          auVar205 = vcmpss_avx(auVar133,ZEXT416(0) << 0x20,1);
          auVar165._8_4_ = 0x3f800000;
          auVar165._0_8_ = 0x3f8000003f800000;
          auVar165._12_4_ = 0x3f800000;
          auVar215._8_4_ = 0xbf800000;
          auVar215._0_8_ = 0xbf800000bf800000;
          auVar215._12_4_ = 0xbf800000;
          auVar205 = vblendvps_avx(auVar165,auVar215,auVar205);
          auVar132 = vblendvps_avx(auVar165,auVar215,auVar132);
          auVar166 = vcmpss_avx(auVar132,auVar205,4);
          auVar166 = vpshufd_avx(ZEXT416(auVar166._0_4_ & 1),0x50);
          auVar166 = vpslld_avx(auVar166,0x1f);
          auVar166 = vpsrad_avx(auVar166,0x1f);
          auVar166 = vpandn_avx(auVar166,_DAT_01f7afb0);
          auVar133 = vmovshdup_avx(auVar132);
          fVar244 = auVar133._0_4_;
          if ((auVar132._0_4_ != fVar244) || (NAN(auVar132._0_4_) || NAN(fVar244))) {
            if ((fVar232 != fVar230) || (NAN(fVar232) || NAN(fVar230))) {
              fVar230 = -fVar230 / (fVar232 - fVar230);
              auVar132 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar230) * 0.0 + fVar230)));
            }
            else {
              auVar132 = ZEXT816(0x3f80000000000000);
              if ((fVar230 != 0.0) || (NAN(fVar230))) {
                auVar132 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar259 = vcmpps_avx(auVar166,auVar132,1);
            auVar133 = vblendps_avx(auVar166,auVar132,2);
            auVar132 = vblendps_avx(auVar132,auVar166,2);
            auVar166 = vblendvps_avx(auVar132,auVar133,auVar259);
          }
          auVar96 = vcmpss_avx(auVar96,ZEXT416(0) << 0x20,1);
          auVar167._8_4_ = 0x3f800000;
          auVar167._0_8_ = 0x3f8000003f800000;
          auVar167._12_4_ = 0x3f800000;
          auVar216._8_4_ = 0xbf800000;
          auVar216._0_8_ = 0xbf800000bf800000;
          auVar216._12_4_ = 0xbf800000;
          auVar96 = vblendvps_avx(auVar167,auVar216,auVar96);
          fVar230 = auVar96._0_4_;
          if ((auVar205._0_4_ != fVar230) || (NAN(auVar205._0_4_) || NAN(fVar230))) {
            if ((fVar227 != fVar225) || (NAN(fVar227) || NAN(fVar225))) {
              fVar225 = -fVar225 / (fVar227 - fVar225);
              auVar96 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar225) * 0.0 + fVar225)));
            }
            else {
              auVar96 = ZEXT816(0x3f80000000000000);
              if ((fVar225 != 0.0) || (NAN(fVar225))) {
                auVar96 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar132 = vcmpps_avx(auVar166,auVar96,1);
            auVar205 = vblendps_avx(auVar166,auVar96,2);
            auVar96 = vblendps_avx(auVar96,auVar166,2);
            auVar166 = vblendvps_avx(auVar96,auVar205,auVar132);
          }
          if ((fVar244 != fVar230) || (NAN(fVar244) || NAN(fVar230))) {
            auVar97._8_4_ = 0x3f800000;
            auVar97._0_8_ = 0x3f8000003f800000;
            auVar97._12_4_ = 0x3f800000;
            auVar96 = vcmpps_avx(auVar166,auVar97,1);
            auVar205 = vinsertps_avx(auVar166,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar168._4_12_ = auVar166._4_12_;
            auVar168._0_4_ = 0x3f800000;
            auVar166 = vblendvps_avx(auVar168,auVar205,auVar96);
          }
          auVar96 = vcmpps_avx(auVar166,_DAT_01f46740,1);
          auVar58._12_4_ = 0;
          auVar58._0_12_ = auVar166._4_12_;
          auVar205 = vinsertps_avx(auVar166,ZEXT416(0x3f800000),0x10);
          auVar96 = vblendvps_avx(auVar205,auVar58 << 0x20,auVar96);
          auVar205 = vmovshdup_avx(auVar96);
        } while (auVar205._0_4_ < auVar96._0_4_);
        auVar98._0_4_ = auVar96._0_4_ + -0.1;
        auVar98._4_4_ = auVar96._4_4_ + 0.1;
        auVar98._8_4_ = auVar96._8_4_ + 0.0;
        auVar98._12_4_ = auVar96._12_4_ + 0.0;
        auVar132 = vshufpd_avx(auVar214,auVar214,3);
        auVar254._8_8_ = 0x3f80000000000000;
        auVar254._0_8_ = 0x3f80000000000000;
        auVar96 = vcmpps_avx(auVar98,auVar254,1);
        auVar56._12_4_ = 0;
        auVar56._0_12_ = auVar98._4_12_;
        auVar205 = vinsertps_avx(auVar98,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar96 = vblendvps_avx(auVar205,auVar56 << 0x20,auVar96);
        auVar205 = vshufpd_avx(auVar268,auVar268,3);
        auVar166 = vshufps_avx(auVar96,auVar96,0x50);
        auVar255._8_4_ = 0x3f800000;
        auVar255._0_8_ = 0x3f8000003f800000;
        auVar255._12_4_ = 0x3f800000;
        auVar133 = vsubps_avx(auVar255,auVar166);
        local_468 = auVar180._0_4_;
        fStack_464 = auVar180._4_4_;
        fStack_460 = auVar180._8_4_;
        fStack_45c = auVar180._12_4_;
        fVar225 = auVar166._0_4_;
        fVar227 = auVar166._4_4_;
        fVar230 = auVar166._8_4_;
        fVar232 = auVar166._12_4_;
        local_5a8 = auVar144._0_4_;
        fStack_5a4 = auVar144._4_4_;
        fStack_5a0 = auVar144._8_4_;
        fStack_59c = auVar144._12_4_;
        fVar244 = auVar133._0_4_;
        fVar245 = auVar133._4_4_;
        fVar246 = auVar133._8_4_;
        fVar231 = auVar133._12_4_;
        auVar99._0_4_ = fVar225 * local_468 + fVar244 * auVar253._0_4_;
        auVar99._4_4_ = fVar227 * fStack_464 + fVar245 * auVar253._4_4_;
        auVar99._8_4_ = fVar230 * fStack_460 + fVar246 * auVar253._0_4_;
        auVar99._12_4_ = fVar232 * fStack_45c + fVar231 * auVar253._4_4_;
        auVar238._0_4_ = auVar132._0_4_ * fVar225 + fVar244 * auVar214._0_4_;
        auVar238._4_4_ = auVar132._4_4_ * fVar227 + fVar245 * auVar214._4_4_;
        auVar238._8_4_ = auVar132._8_4_ * fVar230 + fVar246 * auVar214._0_4_;
        auVar238._12_4_ = auVar132._12_4_ * fVar232 + fVar231 * auVar214._4_4_;
        auVar264._0_4_ = auVar205._0_4_ * fVar225 + fVar244 * fVar117;
        auVar264._4_4_ = auVar205._4_4_ * fVar227 + fVar245 * fVar118;
        auVar264._8_4_ = auVar205._8_4_ * fVar230 + fVar246 * fVar117;
        auVar264._12_4_ = auVar205._12_4_ * fVar232 + fVar231 * fVar118;
        auVar315._0_4_ = fVar225 * local_5a8 + fVar244 * auVar258._16_4_;
        auVar315._4_4_ = fVar227 * fStack_5a4 + fVar245 * auVar258._20_4_;
        auVar315._8_4_ = fVar230 * fStack_5a0 + fVar246 * auVar258._16_4_;
        auVar315._12_4_ = fVar232 * fStack_59c + fVar231 * auVar258._20_4_;
        auVar144 = vsubps_avx(auVar255,auVar96);
        auVar205 = vmovshdup_avx(auVar352);
        auVar180 = vmovsldup_avx(auVar352);
        auVar256._0_4_ = auVar144._0_4_ * auVar180._0_4_ + auVar96._0_4_ * auVar205._0_4_;
        auVar256._4_4_ = auVar144._4_4_ * auVar180._4_4_ + auVar96._4_4_ * auVar205._4_4_;
        auVar256._8_4_ = auVar144._8_4_ * auVar180._8_4_ + auVar96._8_4_ * auVar205._8_4_;
        auVar256._12_4_ = auVar144._12_4_ * auVar180._12_4_ + auVar96._12_4_ * auVar205._12_4_;
        auVar268 = vmovshdup_avx(auVar256);
        auVar96 = vsubps_avx(auVar238,auVar99);
        auVar169._0_4_ = auVar96._0_4_ * 3.0;
        auVar169._4_4_ = auVar96._4_4_ * 3.0;
        auVar169._8_4_ = auVar96._8_4_ * 3.0;
        auVar169._12_4_ = auVar96._12_4_ * 3.0;
        auVar96 = vsubps_avx(auVar264,auVar238);
        auVar192._0_4_ = auVar96._0_4_ * 3.0;
        auVar192._4_4_ = auVar96._4_4_ * 3.0;
        auVar192._8_4_ = auVar96._8_4_ * 3.0;
        auVar192._12_4_ = auVar96._12_4_ * 3.0;
        auVar96 = vsubps_avx(auVar315,auVar264);
        auVar280._0_4_ = auVar96._0_4_ * 3.0;
        auVar280._4_4_ = auVar96._4_4_ * 3.0;
        auVar280._8_4_ = auVar96._8_4_ * 3.0;
        auVar280._12_4_ = auVar96._12_4_ * 3.0;
        auVar205 = vminps_avx(auVar192,auVar280);
        auVar96 = vmaxps_avx(auVar192,auVar280);
        auVar205 = vminps_avx(auVar169,auVar205);
        auVar96 = vmaxps_avx(auVar169,auVar96);
        auVar180 = vshufpd_avx(auVar205,auVar205,3);
        auVar144 = vshufpd_avx(auVar96,auVar96,3);
        auVar205 = vminps_avx(auVar205,auVar180);
        auVar96 = vmaxps_avx(auVar96,auVar144);
        auVar180 = vshufps_avx(ZEXT416((uint)(1.0 / fVar200)),ZEXT416((uint)(1.0 / fVar200)),0);
        auVar281._0_4_ = auVar180._0_4_ * auVar205._0_4_;
        auVar281._4_4_ = auVar180._4_4_ * auVar205._4_4_;
        auVar281._8_4_ = auVar180._8_4_ * auVar205._8_4_;
        auVar281._12_4_ = auVar180._12_4_ * auVar205._12_4_;
        auVar295._0_4_ = auVar180._0_4_ * auVar96._0_4_;
        auVar295._4_4_ = auVar180._4_4_ * auVar96._4_4_;
        auVar295._8_4_ = auVar180._8_4_ * auVar96._8_4_;
        auVar295._12_4_ = auVar180._12_4_ * auVar96._12_4_;
        auVar133 = ZEXT416((uint)(1.0 / (auVar268._0_4_ - auVar256._0_4_)));
        auVar96 = vshufpd_avx(auVar99,auVar99,3);
        auVar205 = vshufpd_avx(auVar238,auVar238,3);
        auVar180 = vshufpd_avx(auVar264,auVar264,3);
        auVar144 = vshufpd_avx(auVar315,auVar315,3);
        auVar96 = vsubps_avx(auVar96,auVar99);
        auVar132 = vsubps_avx(auVar205,auVar238);
        auVar166 = vsubps_avx(auVar180,auVar264);
        auVar144 = vsubps_avx(auVar144,auVar315);
        auVar205 = vminps_avx(auVar96,auVar132);
        auVar96 = vmaxps_avx(auVar96,auVar132);
        auVar180 = vminps_avx(auVar166,auVar144);
        auVar180 = vminps_avx(auVar205,auVar180);
        auVar205 = vmaxps_avx(auVar166,auVar144);
        auVar96 = vmaxps_avx(auVar96,auVar205);
        auVar205 = vshufps_avx(auVar133,auVar133,0);
        auVar345._0_4_ = auVar205._0_4_ * auVar180._0_4_;
        auVar345._4_4_ = auVar205._4_4_ * auVar180._4_4_;
        auVar345._8_4_ = auVar205._8_4_ * auVar180._8_4_;
        auVar345._12_4_ = auVar205._12_4_ * auVar180._12_4_;
        auVar353._0_4_ = auVar205._0_4_ * auVar96._0_4_;
        auVar353._4_4_ = auVar205._4_4_ * auVar96._4_4_;
        auVar353._8_4_ = auVar205._8_4_ * auVar96._8_4_;
        auVar353._12_4_ = auVar205._12_4_ * auVar96._12_4_;
        auVar96 = vmovsldup_avx(auVar256);
        auVar316._4_12_ = auVar96._4_12_;
        auVar316._0_4_ = fVar203;
        auVar323._4_12_ = auVar256._4_12_;
        auVar323._0_4_ = fVar198;
        auVar193._0_4_ = (fVar203 + fVar198) * 0.5;
        auVar193._4_4_ = (auVar96._4_4_ + auVar256._4_4_) * 0.5;
        auVar193._8_4_ = (auVar96._8_4_ + auVar256._8_4_) * 0.5;
        auVar193._12_4_ = (auVar96._12_4_ + auVar256._12_4_) * 0.5;
        auVar96 = vshufps_avx(auVar193,auVar193,0);
        local_258 = auVar18._0_4_;
        fStack_254 = auVar18._4_4_;
        fStack_250 = auVar18._8_4_;
        fStack_24c = auVar18._12_4_;
        fVar225 = auVar96._0_4_;
        fVar227 = auVar96._4_4_;
        fVar230 = auVar96._8_4_;
        fVar232 = auVar96._12_4_;
        p00.field_0.i[0] = auVar276._0_4_;
        p00.field_0.i[1] = auVar276._4_4_;
        p00.field_0.i[2] = auVar276._8_4_;
        p00.field_0.i[3] = auVar276._12_4_;
        auVar134._0_4_ = fVar225 * local_258 + p00.field_0.v[0];
        auVar134._4_4_ = fVar227 * fStack_254 + p00.field_0.v[1];
        auVar134._8_4_ = fVar230 * fStack_250 + p00.field_0.v[2];
        auVar134._12_4_ = fVar232 * fStack_24c + p00.field_0.v[3];
        local_268 = auVar122._0_4_;
        fStack_264 = auVar122._4_4_;
        fStack_260 = auVar122._8_4_;
        fStack_25c = auVar122._12_4_;
        p01.field_0.i[0] = auVar15._0_4_;
        p01.field_0.i[1] = auVar15._4_4_;
        p01.field_0.i[2] = auVar15._8_4_;
        p01.field_0.i[3] = auVar15._12_4_;
        auVar170._0_4_ = fVar225 * local_268 + p01.field_0.v[0];
        auVar170._4_4_ = fVar227 * fStack_264 + p01.field_0.v[1];
        auVar170._8_4_ = fVar230 * fStack_260 + p01.field_0.v[2];
        auVar170._12_4_ = fVar232 * fStack_25c + p01.field_0.v[3];
        local_278 = auVar121._0_4_;
        fStack_274 = auVar121._4_4_;
        fStack_270 = auVar121._8_4_;
        fStack_26c = auVar121._12_4_;
        p02.field_0.i[0] = auVar159._0_4_;
        p02.field_0.i[1] = auVar159._4_4_;
        p02.field_0.i[2] = auVar159._8_4_;
        p02.field_0.i[3] = auVar159._12_4_;
        auVar239._0_4_ = fVar225 * local_278 + p02.field_0.v[0];
        auVar239._4_4_ = fVar227 * fStack_274 + p02.field_0.v[1];
        auVar239._8_4_ = fVar230 * fStack_270 + p02.field_0.v[2];
        auVar239._12_4_ = fVar232 * fStack_26c + p02.field_0.v[3];
        auVar96 = vsubps_avx(auVar170,auVar134);
        auVar135._0_4_ = auVar134._0_4_ + fVar225 * auVar96._0_4_;
        auVar135._4_4_ = auVar134._4_4_ + fVar227 * auVar96._4_4_;
        auVar135._8_4_ = auVar134._8_4_ + fVar230 * auVar96._8_4_;
        auVar135._12_4_ = auVar134._12_4_ + fVar232 * auVar96._12_4_;
        auVar96 = vsubps_avx(auVar239,auVar170);
        auVar171._0_4_ = auVar170._0_4_ + fVar225 * auVar96._0_4_;
        auVar171._4_4_ = auVar170._4_4_ + fVar227 * auVar96._4_4_;
        auVar171._8_4_ = auVar170._8_4_ + fVar230 * auVar96._8_4_;
        auVar171._12_4_ = auVar170._12_4_ + fVar232 * auVar96._12_4_;
        auVar96 = vsubps_avx(auVar171,auVar135);
        fVar225 = auVar135._0_4_ + fVar225 * auVar96._0_4_;
        fVar227 = auVar135._4_4_ + fVar227 * auVar96._4_4_;
        auVar100._0_8_ = CONCAT44(fVar227,fVar225);
        auVar100._8_4_ = auVar135._8_4_ + fVar230 * auVar96._8_4_;
        auVar100._12_4_ = auVar135._12_4_ + fVar232 * auVar96._12_4_;
        fVar230 = auVar96._0_4_ * 3.0;
        fVar232 = auVar96._4_4_ * 3.0;
        auVar136._0_8_ = CONCAT44(fVar232,fVar230);
        auVar136._8_4_ = auVar96._8_4_ * 3.0;
        auVar136._12_4_ = auVar96._12_4_ * 3.0;
        auVar172._8_8_ = auVar100._0_8_;
        auVar172._0_8_ = auVar100._0_8_;
        auVar96 = vshufpd_avx(auVar100,auVar100,3);
        auVar205 = vshufps_avx(auVar193,auVar193,0x55);
        auVar166 = vsubps_avx(auVar96,auVar172);
        auVar332._0_4_ = auVar166._0_4_ * auVar205._0_4_ + fVar225;
        auVar332._4_4_ = auVar166._4_4_ * auVar205._4_4_ + fVar227;
        auVar332._8_4_ = auVar166._8_4_ * auVar205._8_4_ + fVar225;
        auVar332._12_4_ = auVar166._12_4_ * auVar205._12_4_ + fVar227;
        auVar173._8_8_ = auVar136._0_8_;
        auVar173._0_8_ = auVar136._0_8_;
        auVar96 = vshufpd_avx(auVar136,auVar136,1);
        auVar96 = vsubps_avx(auVar96,auVar173);
        auVar137._0_4_ = auVar96._0_4_ * auVar205._0_4_ + fVar230;
        auVar137._4_4_ = auVar96._4_4_ * auVar205._4_4_ + fVar232;
        auVar137._8_4_ = auVar96._8_4_ * auVar205._8_4_ + fVar230;
        auVar137._12_4_ = auVar96._12_4_ * auVar205._12_4_ + fVar232;
        auVar205 = vmovshdup_avx(auVar137);
        auVar240._0_8_ = auVar205._0_8_ ^ 0x8000000080000000;
        auVar240._8_4_ = auVar205._8_4_ ^ 0x80000000;
        auVar240._12_4_ = auVar205._12_4_ ^ 0x80000000;
        auVar180 = vmovshdup_avx(auVar166);
        auVar96 = vunpcklps_avx(auVar180,auVar240);
        auVar144 = vshufps_avx(auVar96,auVar240,4);
        auVar101._0_8_ = auVar166._0_8_ ^ 0x8000000080000000;
        auVar101._8_4_ = -auVar166._8_4_;
        auVar101._12_4_ = -auVar166._12_4_;
        auVar96 = vmovlhps_avx(auVar101,auVar137);
        auVar132 = vshufps_avx(auVar96,auVar137,8);
        auVar96 = ZEXT416((uint)(auVar137._0_4_ * auVar180._0_4_ - auVar166._0_4_ * auVar205._0_4_))
        ;
        auVar205 = vshufps_avx(auVar96,auVar96,0);
        auVar96 = vdivps_avx(auVar144,auVar205);
        auVar205 = vdivps_avx(auVar132,auVar205);
        auVar132 = vinsertps_avx(auVar281,auVar345,0x1c);
        auVar166 = vinsertps_avx(auVar295,auVar353,0x1c);
        auVar133 = vinsertps_avx(auVar345,auVar281,0x4c);
        auVar259 = vinsertps_avx(auVar353,auVar295,0x4c);
        auVar180 = vmovsldup_avx(auVar96);
        auVar174._0_4_ = auVar180._0_4_ * auVar132._0_4_;
        auVar174._4_4_ = auVar180._4_4_ * auVar132._4_4_;
        auVar174._8_4_ = auVar180._8_4_ * auVar132._8_4_;
        auVar174._12_4_ = auVar180._12_4_ * auVar132._12_4_;
        auVar138._0_4_ = auVar166._0_4_ * auVar180._0_4_;
        auVar138._4_4_ = auVar166._4_4_ * auVar180._4_4_;
        auVar138._8_4_ = auVar166._8_4_ * auVar180._8_4_;
        auVar138._12_4_ = auVar166._12_4_ * auVar180._12_4_;
        auVar144 = vminps_avx(auVar174,auVar138);
        auVar180 = vmaxps_avx(auVar138,auVar174);
        auVar260 = vmovsldup_avx(auVar205);
        auVar354._0_4_ = auVar133._0_4_ * auVar260._0_4_;
        auVar354._4_4_ = auVar133._4_4_ * auVar260._4_4_;
        auVar354._8_4_ = auVar133._8_4_ * auVar260._8_4_;
        auVar354._12_4_ = auVar133._12_4_ * auVar260._12_4_;
        auVar175._0_4_ = auVar259._0_4_ * auVar260._0_4_;
        auVar175._4_4_ = auVar259._4_4_ * auVar260._4_4_;
        auVar175._8_4_ = auVar259._8_4_ * auVar260._8_4_;
        auVar175._12_4_ = auVar259._12_4_ * auVar260._12_4_;
        auVar260 = vminps_avx(auVar354,auVar175);
        auVar217._0_4_ = auVar144._0_4_ + auVar260._0_4_;
        auVar217._4_4_ = auVar144._4_4_ + auVar260._4_4_;
        auVar217._8_4_ = auVar144._8_4_ + auVar260._8_4_;
        auVar217._12_4_ = auVar144._12_4_ + auVar260._12_4_;
        auVar144 = vmaxps_avx(auVar175,auVar354);
        auVar260 = vsubps_avx(auVar316,auVar193);
        auVar269 = vsubps_avx(auVar323,auVar193);
        auVar139._0_4_ = auVar180._0_4_ + auVar144._0_4_;
        auVar139._4_4_ = auVar180._4_4_ + auVar144._4_4_;
        auVar139._8_4_ = auVar180._8_4_ + auVar144._8_4_;
        auVar139._12_4_ = auVar180._12_4_ + auVar144._12_4_;
        auVar176._8_8_ = 0x3f800000;
        auVar176._0_8_ = 0x3f800000;
        auVar180 = vsubps_avx(auVar176,auVar139);
        auVar144 = vsubps_avx(auVar176,auVar217);
        fVar246 = auVar260._0_4_;
        auVar218._0_4_ = fVar246 * auVar180._0_4_;
        fVar231 = auVar260._4_4_;
        auVar218._4_4_ = fVar231 * auVar180._4_4_;
        fVar117 = auVar260._8_4_;
        auVar218._8_4_ = fVar117 * auVar180._8_4_;
        fVar118 = auVar260._12_4_;
        auVar218._12_4_ = fVar118 * auVar180._12_4_;
        fVar230 = auVar269._0_4_;
        auVar140._0_4_ = fVar230 * auVar180._0_4_;
        fVar232 = auVar269._4_4_;
        auVar140._4_4_ = fVar232 * auVar180._4_4_;
        fVar244 = auVar269._8_4_;
        auVar140._8_4_ = fVar244 * auVar180._8_4_;
        fVar245 = auVar269._12_4_;
        auVar140._12_4_ = fVar245 * auVar180._12_4_;
        auVar324._0_4_ = fVar246 * auVar144._0_4_;
        auVar324._4_4_ = fVar231 * auVar144._4_4_;
        auVar324._8_4_ = fVar117 * auVar144._8_4_;
        auVar324._12_4_ = fVar118 * auVar144._12_4_;
        auVar177._0_4_ = fVar230 * auVar144._0_4_;
        auVar177._4_4_ = fVar232 * auVar144._4_4_;
        auVar177._8_4_ = fVar244 * auVar144._8_4_;
        auVar177._12_4_ = fVar245 * auVar144._12_4_;
        auVar180 = vminps_avx(auVar218,auVar324);
        auVar144 = vminps_avx(auVar140,auVar177);
        auVar260 = vminps_avx(auVar180,auVar144);
        auVar180 = vmaxps_avx(auVar324,auVar218);
        auVar144 = vmaxps_avx(auVar177,auVar140);
        auVar269 = vshufps_avx(auVar193,auVar193,0x54);
        auVar144 = vmaxps_avx(auVar144,auVar180);
        auVar290 = vshufps_avx(auVar332,auVar332,0);
        auVar291 = vshufps_avx(auVar332,auVar332,0x55);
        auVar180 = vhaddps_avx(auVar260,auVar260);
        auVar144 = vhaddps_avx(auVar144,auVar144);
        auVar194._0_4_ = auVar290._0_4_ * auVar96._0_4_ + auVar291._0_4_ * auVar205._0_4_;
        auVar194._4_4_ = auVar290._4_4_ * auVar96._4_4_ + auVar291._4_4_ * auVar205._4_4_;
        auVar194._8_4_ = auVar290._8_4_ * auVar96._8_4_ + auVar291._8_4_ * auVar205._8_4_;
        auVar194._12_4_ = auVar290._12_4_ * auVar96._12_4_ + auVar291._12_4_ * auVar205._12_4_;
        auVar260 = vsubps_avx(auVar269,auVar194);
        fVar225 = auVar260._0_4_ + auVar180._0_4_;
        fVar227 = auVar260._0_4_ + auVar144._0_4_;
        auVar180 = vmaxss_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar225));
        auVar144 = vminss_avx(ZEXT416((uint)fVar227),ZEXT416((uint)fVar198));
      } while (auVar144._0_4_ < auVar180._0_4_);
      auVar180 = vmovshdup_avx(auVar96);
      auVar102._0_4_ = auVar180._0_4_ * auVar132._0_4_;
      auVar102._4_4_ = auVar180._4_4_ * auVar132._4_4_;
      auVar102._8_4_ = auVar180._8_4_ * auVar132._8_4_;
      auVar102._12_4_ = auVar180._12_4_ * auVar132._12_4_;
      auVar141._0_4_ = auVar166._0_4_ * auVar180._0_4_;
      auVar141._4_4_ = auVar166._4_4_ * auVar180._4_4_;
      auVar141._8_4_ = auVar166._8_4_ * auVar180._8_4_;
      auVar141._12_4_ = auVar166._12_4_ * auVar180._12_4_;
      auVar144 = vminps_avx(auVar102,auVar141);
      auVar180 = vmaxps_avx(auVar141,auVar102);
      auVar132 = vmovshdup_avx(auVar205);
      auVar219._0_4_ = auVar133._0_4_ * auVar132._0_4_;
      auVar219._4_4_ = auVar133._4_4_ * auVar132._4_4_;
      auVar219._8_4_ = auVar133._8_4_ * auVar132._8_4_;
      auVar219._12_4_ = auVar133._12_4_ * auVar132._12_4_;
      auVar142._0_4_ = auVar259._0_4_ * auVar132._0_4_;
      auVar142._4_4_ = auVar259._4_4_ * auVar132._4_4_;
      auVar142._8_4_ = auVar259._8_4_ * auVar132._8_4_;
      auVar142._12_4_ = auVar259._12_4_ * auVar132._12_4_;
      auVar132 = vminps_avx(auVar219,auVar142);
      auVar178._0_4_ = auVar144._0_4_ + auVar132._0_4_;
      auVar178._4_4_ = auVar144._4_4_ + auVar132._4_4_;
      auVar178._8_4_ = auVar144._8_4_ + auVar132._8_4_;
      auVar178._12_4_ = auVar144._12_4_ + auVar132._12_4_;
      auVar144 = vmaxps_avx(auVar142,auVar219);
      auVar103._0_4_ = auVar180._0_4_ + auVar144._0_4_;
      auVar103._4_4_ = auVar180._4_4_ + auVar144._4_4_;
      auVar103._8_4_ = auVar180._8_4_ + auVar144._8_4_;
      auVar103._12_4_ = auVar180._12_4_ + auVar144._12_4_;
      auVar180 = vsubps_avx(auVar254,auVar103);
      auVar144 = vsubps_avx(auVar254,auVar178);
      auVar179._0_4_ = fVar246 * auVar180._0_4_;
      auVar179._4_4_ = fVar231 * auVar180._4_4_;
      auVar179._8_4_ = fVar117 * auVar180._8_4_;
      auVar179._12_4_ = fVar118 * auVar180._12_4_;
      auVar220._0_4_ = fVar246 * auVar144._0_4_;
      auVar220._4_4_ = fVar231 * auVar144._4_4_;
      auVar220._8_4_ = fVar117 * auVar144._8_4_;
      auVar220._12_4_ = fVar118 * auVar144._12_4_;
      auVar104._0_4_ = fVar230 * auVar180._0_4_;
      auVar104._4_4_ = fVar232 * auVar180._4_4_;
      auVar104._8_4_ = fVar244 * auVar180._8_4_;
      auVar104._12_4_ = fVar245 * auVar180._12_4_;
      auVar143._0_4_ = fVar230 * auVar144._0_4_;
      auVar143._4_4_ = fVar232 * auVar144._4_4_;
      auVar143._8_4_ = fVar244 * auVar144._8_4_;
      auVar143._12_4_ = fVar245 * auVar144._12_4_;
      auVar180 = vminps_avx(auVar179,auVar220);
      auVar144 = vminps_avx(auVar104,auVar143);
      auVar180 = vminps_avx(auVar180,auVar144);
      auVar144 = vmaxps_avx(auVar220,auVar179);
      auVar132 = vmaxps_avx(auVar143,auVar104);
      auVar180 = vhaddps_avx(auVar180,auVar180);
      auVar144 = vmaxps_avx(auVar132,auVar144);
      auVar144 = vhaddps_avx(auVar144,auVar144);
      auVar132 = vmovshdup_avx(auVar260);
      auVar166 = ZEXT416((uint)(auVar132._0_4_ + auVar180._0_4_));
      auVar180 = vmaxss_avx(auVar256,auVar166);
      auVar132 = ZEXT416((uint)(auVar132._0_4_ + auVar144._0_4_));
      auVar144 = vminss_avx(auVar132,auVar268);
    } while (auVar144._0_4_ < auVar180._0_4_);
    bVar71 = 0;
    if ((fVar203 < fVar225) && (fVar227 < fVar198)) {
      auVar180 = vcmpps_avx(auVar132,auVar268,1);
      auVar144 = vcmpps_avx(auVar256,auVar166,1);
      auVar180 = vandps_avx(auVar144,auVar180);
      bVar71 = auVar180[0];
    }
    auVar282._8_4_ = 0x7fffffff;
    auVar282._0_8_ = 0x7fffffff7fffffff;
    auVar282._12_4_ = 0x7fffffff;
    p03.field_0.i[0] = auVar210._0_4_;
    p03.field_0.i[1] = auVar210._4_4_;
    p03.field_0.i[2] = auVar210._8_4_;
    p03.field_0.i[3] = auVar210._12_4_;
    if ((3 < (uint)uVar68 || fVar200 < 0.001) || (bVar71 & 1) != 0) {
      lVar70 = 0xc9;
      do {
        lVar70 = lVar70 + -1;
        if (lVar70 == 0) goto LAB_0094941e;
        fVar200 = auVar260._0_4_;
        fVar198 = 1.0 - fVar200;
        auVar180 = ZEXT416((uint)(fVar198 * fVar198 * fVar198));
        auVar180 = vshufps_avx(auVar180,auVar180,0);
        auVar144 = ZEXT416((uint)(fVar200 * 3.0 * fVar198 * fVar198));
        auVar144 = vshufps_avx(auVar144,auVar144,0);
        auVar132 = ZEXT416((uint)(fVar198 * fVar200 * fVar200 * 3.0));
        auVar132 = vshufps_avx(auVar132,auVar132,0);
        auVar166 = ZEXT416((uint)(fVar200 * fVar200 * fVar200));
        auVar166 = vshufps_avx(auVar166,auVar166,0);
        fVar198 = p00.field_0.v[0] * auVar180._0_4_ +
                  p01.field_0.v[0] * auVar144._0_4_ +
                  p03.field_0.v[0] * auVar166._0_4_ + p02.field_0.v[0] * auVar132._0_4_;
        fVar200 = p00.field_0.v[1] * auVar180._4_4_ +
                  p01.field_0.v[1] * auVar144._4_4_ +
                  p03.field_0.v[1] * auVar166._4_4_ + p02.field_0.v[1] * auVar132._4_4_;
        auVar105._0_8_ = CONCAT44(fVar200,fVar198);
        auVar105._8_4_ =
             p00.field_0.v[2] * auVar180._8_4_ +
             p01.field_0.v[2] * auVar144._8_4_ +
             p03.field_0.v[2] * auVar166._8_4_ + p02.field_0.v[2] * auVar132._8_4_;
        auVar105._12_4_ =
             p00.field_0.v[3] * auVar180._12_4_ +
             p01.field_0.v[3] * auVar144._12_4_ +
             p03.field_0.v[3] * auVar166._12_4_ + p02.field_0.v[3] * auVar132._12_4_;
        auVar145._8_8_ = auVar105._0_8_;
        auVar145._0_8_ = auVar105._0_8_;
        auVar144 = vshufpd_avx(auVar105,auVar105,1);
        auVar180 = vmovshdup_avx(auVar260);
        auVar144 = vsubps_avx(auVar144,auVar145);
        auVar106._0_4_ = auVar180._0_4_ * auVar144._0_4_ + fVar198;
        auVar106._4_4_ = auVar180._4_4_ * auVar144._4_4_ + fVar200;
        auVar106._8_4_ = auVar180._8_4_ * auVar144._8_4_ + fVar198;
        auVar106._12_4_ = auVar180._12_4_ * auVar144._12_4_ + fVar200;
        auVar180 = vshufps_avx(auVar106,auVar106,0);
        auVar144 = vshufps_avx(auVar106,auVar106,0x55);
        auVar146._0_4_ = auVar96._0_4_ * auVar180._0_4_ + auVar205._0_4_ * auVar144._0_4_;
        auVar146._4_4_ = auVar96._4_4_ * auVar180._4_4_ + auVar205._4_4_ * auVar144._4_4_;
        auVar146._8_4_ = auVar96._8_4_ * auVar180._8_4_ + auVar205._8_4_ * auVar144._8_4_;
        auVar146._12_4_ = auVar96._12_4_ * auVar180._12_4_ + auVar205._12_4_ * auVar144._12_4_;
        auVar260 = vsubps_avx(auVar260,auVar146);
        auVar180 = vandps_avx(auVar282,auVar106);
        auVar144 = vshufps_avx(auVar180,auVar180,0xf5);
        auVar180 = vmaxss_avx(auVar144,auVar180);
      } while (fVar196 <= auVar180._0_4_);
      fVar198 = auVar260._0_4_;
      if ((0.0 <= fVar198) && (fVar198 <= 1.0)) {
        auVar96 = vmovshdup_avx(auVar260);
        fVar200 = auVar96._0_4_;
        if ((0.0 <= fVar200) && (fVar200 <= 1.0)) {
          auVar96 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                  ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar259 = vinsertps_avx(auVar96,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28)
          ;
          auVar96 = vdpps_avx(auVar259,auVar289,0x7f);
          auVar205 = vdpps_avx(auVar259,auVar19,0x7f);
          auVar180 = vdpps_avx(auVar259,auVar275,0x7f);
          auVar144 = vdpps_avx(auVar259,auVar16,0x7f);
          auVar132 = vdpps_avx(auVar259,auVar17,0x7f);
          auVar166 = vdpps_avx(auVar259,auVar77,0x7f);
          auVar133 = vdpps_avx(auVar259,auVar78,0x7f);
          auVar259 = vdpps_avx(auVar259,auVar79,0x7f);
          fVar232 = 1.0 - fVar200;
          fVar244 = 1.0 - fVar198;
          fVar203 = auVar260._4_4_;
          fVar225 = auVar260._8_4_;
          fVar227 = auVar260._12_4_;
          fVar230 = fVar244 * fVar198 * fVar198 * 3.0;
          auVar265._0_4_ = fVar198 * fVar198 * fVar198;
          auVar265._4_4_ = fVar203 * fVar203 * fVar203;
          auVar265._8_4_ = fVar225 * fVar225 * fVar225;
          auVar265._12_4_ = fVar227 * fVar227 * fVar227;
          fVar225 = fVar244 * fVar244 * fVar198 * 3.0;
          fVar227 = fVar244 * fVar244 * fVar244;
          fVar203 = fVar227 * (fVar232 * auVar96._0_4_ + fVar200 * auVar132._0_4_) +
                    (fVar232 * auVar205._0_4_ + auVar166._0_4_ * fVar200) * fVar225 +
                    fVar230 * (auVar133._0_4_ * fVar200 + fVar232 * auVar180._0_4_) +
                    auVar265._0_4_ * (fVar232 * auVar144._0_4_ + fVar200 * auVar259._0_4_);
          auVar96 = ZEXT416((uint)fVar203);
          if (((fVar183 <= fVar203) &&
              (fVar232 = *(float *)(ray + k * 4 + 0x80), fVar203 <= fVar232)) &&
             (pGVar8 = (context->scene->geometries).items[uVar67].ptr,
             (pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
            local_1e8 = vshufps_avx(auVar260,auVar260,0x55);
            auVar296._8_4_ = 0x3f800000;
            auVar296._0_8_ = 0x3f8000003f800000;
            auVar296._12_4_ = 0x3f800000;
            auVar205 = vsubps_avx(auVar296,local_1e8);
            fVar245 = local_1e8._0_4_;
            fVar246 = local_1e8._4_4_;
            fVar231 = local_1e8._8_4_;
            fVar117 = local_1e8._12_4_;
            fVar118 = auVar205._0_4_;
            fVar119 = auVar205._4_4_;
            fVar120 = auVar205._8_4_;
            fVar202 = auVar205._12_4_;
            auVar317._0_4_ = fVar245 * auVar313._0_4_ + fVar118 * auVar293._0_4_;
            auVar317._4_4_ = fVar246 * auVar313._4_4_ + fVar119 * auVar293._4_4_;
            auVar317._8_4_ = fVar231 * auVar313._8_4_ + fVar120 * auVar293._8_4_;
            auVar317._12_4_ = fVar117 * auVar313._12_4_ + fVar202 * auVar293._12_4_;
            auVar325._0_4_ = fVar245 * auVar331._0_4_ + fVar118 * fVar74;
            auVar325._4_4_ = fVar246 * auVar331._4_4_ + fVar119 * fVar115;
            auVar325._8_4_ = fVar231 * auVar331._8_4_ + fVar120 * fVar197;
            auVar325._12_4_ = fVar117 * auVar331._12_4_ + fVar202 * fVar204;
            auVar333._0_4_ = fVar245 * fVar76 + fVar118 * auVar321._0_4_;
            auVar333._4_4_ = fVar246 * fVar184 + fVar119 * auVar321._4_4_;
            auVar333._8_4_ = fVar231 * fVar201 + fVar120 * auVar321._8_4_;
            auVar333._12_4_ = fVar117 * fVar228 + fVar202 * auVar321._12_4_;
            auVar297._0_4_ = fVar245 * auVar360._0_4_ + fVar118 * fVar75;
            auVar297._4_4_ = fVar246 * auVar360._4_4_ + fVar119 * fVar116;
            auVar297._8_4_ = fVar231 * auVar360._8_4_ + fVar120 * fVar199;
            auVar297._12_4_ = fVar117 * auVar360._12_4_ + fVar202 * fVar226;
            auVar132 = vsubps_avx(auVar325,auVar317);
            auVar166 = vsubps_avx(auVar333,auVar325);
            auVar133 = vsubps_avx(auVar297,auVar333);
            local_1f8 = vshufps_avx(auVar260,auVar260,0);
            fVar117 = local_1f8._0_4_;
            fVar118 = local_1f8._4_4_;
            fVar119 = local_1f8._8_4_;
            fVar120 = local_1f8._12_4_;
            auVar205 = vshufps_avx(ZEXT416((uint)fVar244),ZEXT416((uint)fVar244),0);
            fVar244 = auVar205._0_4_;
            fVar245 = auVar205._4_4_;
            fVar246 = auVar205._8_4_;
            fVar231 = auVar205._12_4_;
            auVar205 = vshufps_avx(auVar265,auVar265,0);
            local_378 = auVar185._0_4_;
            fStack_374 = auVar185._4_4_;
            fStack_370 = auVar185._8_4_;
            fStack_36c = auVar185._12_4_;
            auVar180 = vshufps_avx(ZEXT416((uint)fVar230),ZEXT416((uint)fVar230),0);
            local_368 = auVar153._0_4_;
            fStack_364 = auVar153._4_4_;
            fStack_360 = auVar153._8_4_;
            fStack_35c = auVar153._12_4_;
            auVar144 = vshufps_avx(ZEXT416((uint)fVar225),ZEXT416((uint)fVar225),0);
            local_358 = auVar152._0_4_;
            fStack_354 = auVar152._4_4_;
            fStack_350 = auVar152._8_4_;
            fStack_34c = auVar152._12_4_;
            auVar257._0_4_ =
                 (fVar244 * (fVar244 * auVar132._0_4_ + fVar117 * auVar166._0_4_) +
                 fVar117 * (fVar244 * auVar166._0_4_ + fVar117 * auVar133._0_4_)) * 3.0;
            auVar257._4_4_ =
                 (fVar245 * (fVar245 * auVar132._4_4_ + fVar118 * auVar166._4_4_) +
                 fVar118 * (fVar245 * auVar166._4_4_ + fVar118 * auVar133._4_4_)) * 3.0;
            auVar257._8_4_ =
                 (fVar246 * (fVar246 * auVar132._8_4_ + fVar119 * auVar166._8_4_) +
                 fVar119 * (fVar246 * auVar166._8_4_ + fVar119 * auVar133._8_4_)) * 3.0;
            auVar257._12_4_ =
                 (fVar231 * (fVar231 * auVar132._12_4_ + fVar120 * auVar166._12_4_) +
                 fVar120 * (fVar231 * auVar166._12_4_ + fVar120 * auVar133._12_4_)) * 3.0;
            auVar132 = vshufps_avx(ZEXT416((uint)fVar227),ZEXT416((uint)fVar227),0);
            local_348 = auVar151._0_4_;
            fStack_344 = auVar151._4_4_;
            fStack_340 = auVar151._8_4_;
            fStack_33c = auVar151._12_4_;
            auVar221._0_4_ =
                 auVar132._0_4_ * local_348 +
                 auVar144._0_4_ * local_358 +
                 auVar205._0_4_ * local_378 + auVar180._0_4_ * local_368;
            auVar221._4_4_ =
                 auVar132._4_4_ * fStack_344 +
                 auVar144._4_4_ * fStack_354 +
                 auVar205._4_4_ * fStack_374 + auVar180._4_4_ * fStack_364;
            auVar221._8_4_ =
                 auVar132._8_4_ * fStack_340 +
                 auVar144._8_4_ * fStack_350 +
                 auVar205._8_4_ * fStack_370 + auVar180._8_4_ * fStack_360;
            auVar221._12_4_ =
                 auVar132._12_4_ * fStack_33c +
                 auVar144._12_4_ * fStack_34c +
                 auVar205._12_4_ * fStack_36c + auVar180._12_4_ * fStack_35c;
            auVar205 = vshufps_avx(auVar257,auVar257,0xc9);
            auVar241._0_4_ = auVar221._0_4_ * auVar205._0_4_;
            auVar241._4_4_ = auVar221._4_4_ * auVar205._4_4_;
            auVar241._8_4_ = auVar221._8_4_ * auVar205._8_4_;
            auVar241._12_4_ = auVar221._12_4_ * auVar205._12_4_;
            auVar205 = vshufps_avx(auVar221,auVar221,0xc9);
            auVar222._0_4_ = auVar257._0_4_ * auVar205._0_4_;
            auVar222._4_4_ = auVar257._4_4_ * auVar205._4_4_;
            auVar222._8_4_ = auVar257._8_4_ * auVar205._8_4_;
            auVar222._12_4_ = auVar257._12_4_ * auVar205._12_4_;
            auVar205 = vsubps_avx(auVar222,auVar241);
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              *(float *)(ray + k * 4 + 0x80) = fVar203;
              uVar4 = vextractps_avx(auVar205,1);
              *(undefined4 *)(ray + k * 4 + 0xc0) = uVar4;
              uVar4 = vextractps_avx(auVar205,2);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
              *(int *)(ray + k * 4 + 0xe0) = auVar205._0_4_;
              *(float *)(ray + k * 4 + 0xf0) = fVar198;
              *(float *)(ray + k * 4 + 0x100) = fVar200;
              *(uint *)(ray + k * 4 + 0x110) = uVar7;
              *(uint *)(ray + k * 4 + 0x120) = uVar67;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              auVar180 = vshufps_avx(auVar205,auVar205,0x55);
              auVar144 = vshufps_avx(auVar205,auVar205,0xaa);
              local_208 = vshufps_avx(auVar205,auVar205,0);
              local_228[0] = (RTCHitN)auVar180[0];
              local_228[1] = (RTCHitN)auVar180[1];
              local_228[2] = (RTCHitN)auVar180[2];
              local_228[3] = (RTCHitN)auVar180[3];
              local_228[4] = (RTCHitN)auVar180[4];
              local_228[5] = (RTCHitN)auVar180[5];
              local_228[6] = (RTCHitN)auVar180[6];
              local_228[7] = (RTCHitN)auVar180[7];
              local_228[8] = (RTCHitN)auVar180[8];
              local_228[9] = (RTCHitN)auVar180[9];
              local_228[10] = (RTCHitN)auVar180[10];
              local_228[0xb] = (RTCHitN)auVar180[0xb];
              local_228[0xc] = (RTCHitN)auVar180[0xc];
              local_228[0xd] = (RTCHitN)auVar180[0xd];
              local_228[0xe] = (RTCHitN)auVar180[0xe];
              local_228[0xf] = (RTCHitN)auVar180[0xf];
              local_218 = auVar144;
              local_3a8 = auVar311._0_8_;
              uStack_3a0 = auVar311._8_8_;
              local_1d8 = local_3a8;
              uStack_1d0 = uStack_3a0;
              local_1c8 = auVar160;
              vcmpps_avx(ZEXT1632(auVar160),ZEXT1632(auVar160),0xf);
              uStack_1b4 = context->user->instID[0];
              local_1b8 = uStack_1b4;
              uStack_1b0 = uStack_1b4;
              uStack_1ac = uStack_1b4;
              uStack_1a8 = context->user->instPrimID[0];
              uStack_1a4 = uStack_1a8;
              uStack_1a0 = uStack_1a8;
              uStack_19c = uStack_1a8;
              *(float *)(ray + k * 4 + 0x80) = fVar203;
              local_448 = *local_438;
              args.valid = (int *)local_448;
              args.geometryUserPtr = pGVar8->userPtr;
              args.context = context->user;
              args.hit = local_228;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar8->intersectionFilterN)(&args);
                auVar356._8_56_ = extraout_var;
                auVar356._0_8_ = extraout_XMM1_Qa;
                auVar96 = auVar356._0_16_;
              }
              if (local_448 == (undefined1  [16])0x0) {
                auVar205 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar96 = vpcmpeqd_avx(auVar96,auVar96);
                auVar205 = auVar205 ^ auVar96;
              }
              else {
                p_Var13 = context->args->filter;
                auVar96 = vpcmpeqd_avx(auVar144,auVar144);
                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var13)(&args);
                  auVar96 = vpcmpeqd_avx(auVar96,auVar96);
                }
                auVar180 = vpcmpeqd_avx(local_448,_DAT_01f45a50);
                auVar205 = auVar180 ^ auVar96;
                if (local_448 != (undefined1  [16])0x0) {
                  auVar180 = auVar180 ^ auVar96;
                  auVar96 = vmaskmovps_avx(auVar180,*(undefined1 (*) [16])args.hit);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar96;
                  auVar96 = vmaskmovps_avx(auVar180,*(undefined1 (*) [16])(args.hit + 0x10));
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar96;
                  auVar96 = vmaskmovps_avx(auVar180,*(undefined1 (*) [16])(args.hit + 0x20));
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar96;
                  auVar96 = vmaskmovps_avx(auVar180,*(undefined1 (*) [16])(args.hit + 0x30));
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar96;
                  auVar96 = vmaskmovps_avx(auVar180,*(undefined1 (*) [16])(args.hit + 0x40));
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar96;
                  auVar96 = vmaskmovps_avx(auVar180,*(undefined1 (*) [16])(args.hit + 0x50));
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar96;
                  auVar96 = vmaskmovps_avx(auVar180,*(undefined1 (*) [16])(args.hit + 0x60));
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar96;
                  auVar96 = vmaskmovps_avx(auVar180,*(undefined1 (*) [16])(args.hit + 0x70));
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar96;
                  auVar96 = vmaskmovps_avx(auVar180,*(undefined1 (*) [16])(args.hit + 0x80));
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar96;
                }
              }
              auVar107._8_8_ = 0x100000001;
              auVar107._0_8_ = 0x100000001;
              if ((auVar107 & auVar205) == (undefined1  [16])0x0) {
                *(float *)(ray + k * 4 + 0x80) = fVar232;
              }
            }
          }
        }
      }
      goto LAB_0094941e;
    }
    auVar96 = vinsertps_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar198),0x10);
    auVar362 = ZEXT1664(auVar96);
    auVar356 = ZEXT1664(auVar256);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }